

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_rgb.c
# Opt level: O3

void rgb32_yuv420_sse(uint32_t width,uint32_t height,uint8_t *RGBA,uint32_t RGBA_stride,uint8_t *Y,
                     uint8_t *U,uint8_t *V,uint32_t Y_stride,uint32_t UV_stride,YCbCrType yuv_type)

{
  byte *pbVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  byte *pbVar5;
  uint8_t *puVar6;
  char cVar7;
  int iVar22;
  int iVar23;
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  undefined1 auVar81 [15];
  undefined1 auVar82 [15];
  undefined1 auVar83 [15];
  undefined1 auVar84 [15];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  uint8_t uVar96;
  uint8_t uVar97;
  byte bVar98;
  byte bVar99;
  byte bVar100;
  byte bVar101;
  byte bVar102;
  byte bVar103;
  byte bVar104;
  byte bVar105;
  byte bVar106;
  byte bVar107;
  byte bVar108;
  byte bVar109;
  byte bVar110;
  byte bVar111;
  byte bVar112;
  byte bVar113;
  byte bVar114;
  byte bVar115;
  byte bVar116;
  byte bVar117;
  byte bVar118;
  byte bVar119;
  byte bVar120;
  byte bVar121;
  byte bVar122;
  byte bVar123;
  byte bVar124;
  byte bVar125;
  byte bVar126;
  byte bVar127;
  byte bVar128;
  byte bVar129;
  byte bVar130;
  byte bVar131;
  byte bVar132;
  byte bVar133;
  byte bVar134;
  byte bVar135;
  byte bVar136;
  byte bVar137;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [15];
  unkuint9 Var184;
  undefined1 auVar185 [11];
  undefined1 auVar186 [13];
  undefined1 auVar187 [15];
  unkuint9 Var188;
  undefined1 auVar189 [11];
  undefined1 auVar190 [13];
  undefined1 auVar191 [15];
  unkuint9 Var192;
  undefined1 auVar193 [11];
  undefined1 auVar194 [13];
  undefined1 auVar195 [15];
  undefined1 auVar196 [11];
  undefined1 auVar197 [13];
  undefined1 auVar198 [15];
  undefined1 auVar199 [11];
  undefined1 auVar200 [13];
  undefined1 auVar201 [15];
  undefined1 auVar202 [11];
  undefined1 auVar203 [13];
  undefined1 auVar204 [15];
  undefined1 auVar205 [11];
  undefined1 auVar206 [13];
  undefined1 auVar207 [15];
  undefined1 auVar208 [11];
  undefined1 auVar209 [13];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [15];
  undefined1 auVar256 [11];
  undefined1 auVar257 [13];
  undefined1 auVar258 [15];
  undefined1 auVar259 [11];
  undefined1 auVar260 [13];
  undefined1 auVar261 [15];
  undefined1 auVar262 [11];
  undefined1 auVar263 [13];
  undefined1 auVar264 [15];
  undefined1 auVar265 [11];
  undefined1 auVar266 [13];
  undefined1 auVar267 [15];
  undefined1 auVar268 [11];
  undefined1 auVar269 [13];
  undefined1 auVar270 [15];
  undefined1 auVar271 [11];
  undefined1 auVar272 [13];
  undefined1 auVar273 [15];
  undefined1 auVar274 [11];
  undefined1 auVar275 [13];
  undefined1 auVar276 [15];
  undefined1 auVar277 [11];
  undefined1 auVar278 [13];
  undefined3 uVar279;
  undefined3 uVar280;
  undefined1 auVar281 [15];
  undefined1 auVar282 [15];
  undefined8 uVar283;
  undefined1 auVar284 [15];
  undefined1 auVar285 [15];
  undefined1 auVar286 [15];
  undefined1 auVar287 [15];
  undefined1 auVar288 [15];
  undefined1 auVar289 [15];
  undefined1 auVar290 [15];
  undefined1 auVar291 [15];
  undefined1 auVar292 [15];
  undefined1 auVar293 [15];
  undefined1 auVar294 [15];
  undefined1 auVar295 [15];
  undefined1 auVar296 [15];
  undefined1 auVar297 [15];
  undefined1 auVar298 [15];
  undefined1 auVar299 [15];
  undefined1 auVar300 [15];
  undefined1 auVar301 [15];
  undefined1 auVar302 [15];
  undefined1 auVar303 [15];
  undefined1 auVar304 [15];
  undefined1 auVar305 [15];
  undefined1 auVar306 [15];
  undefined1 auVar307 [15];
  undefined1 auVar308 [15];
  undefined1 auVar309 [15];
  undefined1 auVar310 [15];
  undefined1 auVar311 [15];
  undefined1 auVar312 [15];
  undefined1 auVar313 [15];
  uint uVar314;
  uint uVar315;
  undefined5 uVar316;
  undefined5 uVar317;
  undefined1 auVar318 [12];
  undefined8 uVar319;
  undefined1 auVar320 [12];
  undefined1 auVar321 [12];
  undefined1 auVar322 [12];
  undefined1 auVar323 [12];
  undefined1 auVar324 [12];
  undefined1 auVar325 [12];
  undefined1 auVar326 [12];
  undefined1 auVar327 [14];
  undefined8 uVar328;
  undefined1 auVar329 [14];
  undefined1 auVar330 [14];
  undefined1 auVar331 [14];
  undefined1 auVar332 [14];
  undefined1 auVar333 [14];
  undefined1 auVar334 [14];
  undefined1 auVar335 [14];
  ulong uVar336;
  long lVar337;
  ulong uVar338;
  ulong uVar339;
  uint uVar340;
  uint uVar341;
  ulong uVar342;
  undefined1 auVar343 [16];
  ushort uVar344;
  short sVar345;
  ushort uVar361;
  ushort uVar362;
  ushort uVar363;
  ushort uVar364;
  ushort uVar365;
  ushort uVar366;
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  ushort uVar367;
  ushort uVar368;
  ushort uVar377;
  ushort uVar378;
  ushort uVar379;
  ushort uVar380;
  ushort uVar381;
  ushort uVar382;
  ushort uVar383;
  undefined1 auVar369 [16];
  undefined1 auVar384 [16];
  ushort uVar385;
  short sVar386;
  ushort uVar387;
  ushort uVar389;
  short sVar390;
  ushort uVar391;
  short sVar392;
  ushort uVar393;
  ushort uVar394;
  short sVar395;
  ushort uVar396;
  ushort uVar397;
  ushort uVar398;
  short sVar399;
  ushort uVar400;
  ushort uVar401;
  ushort uVar402;
  short sVar403;
  ushort uVar404;
  ushort uVar405;
  short sVar406;
  ushort uVar407;
  ushort uVar408;
  short sVar409;
  ushort uVar410;
  undefined1 auVar388 [16];
  ushort uVar411;
  short sVar412;
  ushort uVar413;
  short sVar414;
  short sVar415;
  short sVar416;
  short sVar417;
  ushort uVar418;
  short sVar419;
  short sVar420;
  short sVar421;
  short sVar422;
  undefined1 auVar423 [16];
  undefined1 auVar431 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar460 [16];
  short sVar477;
  short sVar478;
  short sVar479;
  short sVar480;
  short sVar481;
  undefined1 auVar466 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  short sVar482;
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  short sVar492;
  short sVar503;
  short sVar504;
  short sVar505;
  short sVar506;
  short sVar507;
  short sVar508;
  undefined1 auVar493 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  short sVar509;
  undefined1 auVar510 [16];
  undefined1 auVar518 [16];
  short local_f8;
  short sStack_f6;
  short local_e8;
  short sStack_e6;
  short local_d8;
  short sStack_d6;
  undefined1 local_c8 [16];
  short local_b8;
  short sStack_b6;
  short local_a8;
  short sStack_a6;
  short local_78;
  short sStack_76;
  short local_68;
  short sStack_66;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar444 [16];
  undefined1 auVar453 [16];
  undefined1 auVar445 [16];
  undefined1 auVar454 [16];
  undefined1 auVar446 [16];
  undefined1 auVar455 [16];
  undefined1 auVar447 [16];
  undefined1 auVar456 [16];
  undefined1 auVar448 [16];
  undefined1 auVar457 [16];
  undefined1 auVar449 [16];
  undefined1 auVar458 [16];
  undefined1 auVar450 [16];
  undefined1 auVar459 [16];
  byte bVar461;
  byte bVar462;
  byte bVar463;
  byte bVar464;
  byte bVar465;
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  
  if (height != 1) {
    uVar336 = (ulong)yuv_type;
    iVar22 = RGBA_stride * 2;
    iVar23 = Y_stride * 2;
    uVar342 = 0;
    uVar339 = 0;
    uVar340 = 0;
    do {
      if (width != 0x1f) {
        uVar338 = (ulong)((uVar340 >> 1) * UV_stride);
        auVar346 = pshuflw(ZEXT116(RGB2YUV[uVar336].r_factor),ZEXT116(RGB2YUV[uVar336].r_factor),0);
        auVar347 = pshuflw(ZEXT116(RGB2YUV[uVar336].g_factor),ZEXT116(RGB2YUV[uVar336].g_factor),0);
        auVar348 = pshuflw(ZEXT116(RGB2YUV[uVar336].b_factor),ZEXT116(RGB2YUV[uVar336].b_factor),0);
        auVar349 = pshuflw(ZEXT116(RGB2YUV[uVar336].y_factor),ZEXT116(RGB2YUV[uVar336].y_factor),0);
        auVar350 = pshuflw(ZEXT116(RGB2YUV[uVar336].y_offset),ZEXT116(RGB2YUV[uVar336].y_offset),0);
        auVar351 = pshuflw(ZEXT116(RGB2YUV[uVar336].cb_factor),ZEXT116(RGB2YUV[uVar336].cb_factor),0
                          );
        auVar352 = pshuflw(ZEXT116(RGB2YUV[uVar336].cr_factor),ZEXT116(RGB2YUV[uVar336].cr_factor),0
                          );
        lVar337 = 0;
        uVar341 = 0;
        do {
          auVar441 = *(undefined1 (*) [16])(RGBA + lVar337 * 8 + uVar339);
          puVar2 = RGBA + lVar337 * 8 + uVar339 + 0x10;
          puVar3 = RGBA + lVar337 * 8 + uVar339 + 0x20;
          puVar4 = RGBA + lVar337 * 8 + uVar339 + 0x30;
          uVar96 = puVar4[9];
          uVar97 = puVar4[0xd];
          pbVar1 = RGBA + lVar337 * 8 + (ulong)RGBA_stride;
          bVar98 = *pbVar1;
          bVar99 = pbVar1[1];
          bVar100 = pbVar1[2];
          bVar101 = pbVar1[4];
          bVar102 = pbVar1[5];
          bVar103 = pbVar1[6];
          bVar104 = pbVar1[8];
          bVar105 = pbVar1[9];
          bVar106 = pbVar1[10];
          bVar107 = pbVar1[0xc];
          bVar108 = pbVar1[0xd];
          bVar109 = pbVar1[0xe];
          pbVar5 = RGBA + lVar337 * 8 + (ulong)RGBA_stride + 0x10;
          bVar110 = *pbVar5;
          bVar111 = pbVar5[1];
          bVar112 = pbVar5[2];
          bVar113 = pbVar5[4];
          bVar114 = pbVar5[5];
          bVar115 = pbVar5[6];
          bVar116 = pbVar5[8];
          bVar117 = pbVar5[9];
          bVar118 = pbVar5[10];
          bVar119 = pbVar5[0xc];
          bVar120 = pbVar5[0xd];
          bVar121 = pbVar5[0xe];
          pbVar5 = RGBA + lVar337 * 8 + (ulong)RGBA_stride + 0x20;
          bVar122 = *pbVar5;
          bVar13 = pbVar5[1];
          bVar123 = pbVar5[2];
          bVar124 = pbVar5[4];
          bVar125 = pbVar5[5];
          bVar126 = pbVar5[6];
          bVar127 = pbVar5[8];
          bVar128 = pbVar5[10];
          bVar129 = pbVar5[0xc];
          bVar130 = pbVar5[0xd];
          bVar131 = pbVar5[0xe];
          puVar6 = RGBA + lVar337 * 8 + (ulong)RGBA_stride + 0x30;
          bVar132 = puVar6[2];
          bVar133 = puVar6[5];
          bVar134 = puVar6[6];
          bVar135 = puVar6[10];
          bVar136 = puVar6[0xd];
          bVar137 = puVar6[0xe];
          auVar450._0_14_ = auVar441._0_14_;
          auVar450[0xe] = auVar441[7];
          auVar450[0xf] = pbVar1[7];
          auVar449._14_2_ = auVar450._14_2_;
          auVar449._0_13_ = auVar441._0_13_;
          auVar449[0xd] = bVar103;
          bVar463 = auVar441[6];
          auVar448._13_3_ = auVar449._13_3_;
          auVar448._0_12_ = auVar441._0_12_;
          auVar448[0xc] = bVar463;
          auVar447._12_4_ = auVar448._12_4_;
          auVar447._0_11_ = auVar441._0_11_;
          auVar447[0xb] = bVar102;
          bVar464 = auVar441[5];
          auVar446._11_5_ = auVar447._11_5_;
          auVar446._0_10_ = auVar441._0_10_;
          auVar446[10] = bVar464;
          auVar445._10_6_ = auVar446._10_6_;
          auVar445._0_9_ = auVar441._0_9_;
          auVar445[9] = bVar101;
          bVar462 = auVar441[4];
          auVar444._9_7_ = auVar445._9_7_;
          auVar444._0_8_ = auVar441._0_8_;
          auVar444[8] = bVar462;
          auVar142._1_8_ = auVar444._8_8_;
          auVar142[0] = pbVar1[3];
          auVar142._9_7_ = 0;
          auVar141._10_6_ = 0;
          auVar141._0_10_ = SUB1610(auVar142 << 0x38,6);
          bVar461 = auVar441[2];
          auVar140._11_5_ = 0;
          auVar140._0_11_ = SUB1611(auVar141 << 0x30,5);
          auVar139._12_4_ = 0;
          auVar139._0_12_ = SUB1612(auVar140 << 0x28,4);
          auVar138._13_3_ = 0;
          auVar138._0_13_ = SUB1613(auVar139 << 0x20,3);
          auVar443._14_2_ = 0;
          auVar443._0_14_ = SUB1614(auVar138 << 0x18,2);
          auVar443 = auVar443 << 0x10;
          auVar473._0_14_ = auVar443._0_14_;
          auVar473[0xe] = pbVar1[3];
          auVar473[0xf] = pbVar5[3];
          auVar472._14_2_ = auVar473._14_2_;
          auVar472._0_13_ = auVar443._0_13_;
          auVar472[0xd] = puVar3[3];
          auVar471._13_3_ = auVar472._13_3_;
          auVar471._0_12_ = auVar443._0_12_;
          auVar471[0xc] = auVar441[3];
          auVar470._12_4_ = auVar471._12_4_;
          auVar470._0_11_ = auVar443._0_11_;
          auVar470[0xb] = bVar123;
          auVar469._11_5_ = auVar470._11_5_;
          auVar469._0_10_ = auVar443._0_10_;
          auVar469[10] = bVar100;
          auVar468._10_6_ = auVar469._10_6_;
          auVar468._0_9_ = auVar443._0_9_;
          auVar468[9] = puVar3[2];
          auVar467._9_7_ = auVar468._9_7_;
          auVar467._0_8_ = auVar443._0_8_;
          auVar467[8] = bVar461;
          auVar147._1_8_ = auVar467._8_8_;
          auVar147[0] = bVar13;
          auVar147._9_7_ = 0;
          auVar146._10_6_ = 0;
          auVar146._0_10_ = SUB1610(auVar147 << 0x38,6);
          auVar145._11_5_ = 0;
          auVar145._0_11_ = SUB1611(auVar146 << 0x30,5);
          auVar144._12_4_ = 0;
          auVar144._0_12_ = SUB1612(auVar145 << 0x28,4);
          auVar143._13_3_ = 0;
          auVar143._0_13_ = SUB1613(auVar144 << 0x20,3);
          auVar466._14_2_ = 0;
          auVar466._0_14_ = SUB1614(auVar143 << 0x18,2);
          auVar466 = auVar466 << 0x10;
          auVar152._1_8_ =
               (long)(CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(pbVar5[0xb],
                                                                                     pbVar1[0xb]),
                                                                            puVar3[0xb]),
                                                                   auVar441[0xb]),bVar128),bVar106),
                                        puVar3[10]),CONCAT11(auVar441[10],pbVar1[0xb])) >> 8);
          auVar152[0] = pbVar5[9];
          auVar152._9_7_ = 0;
          auVar151._10_6_ = 0;
          auVar151._0_10_ = SUB1610(auVar152 << 0x38,6);
          auVar150._11_5_ = 0;
          auVar150._0_11_ = SUB1611(auVar151 << 0x30,5);
          auVar149._12_4_ = 0;
          auVar149._0_12_ = SUB1612(auVar150 << 0x28,4);
          auVar148._13_3_ = 0;
          auVar148._0_13_ = SUB1613(auVar149 << 0x20,3);
          auVar388._0_14_ = SUB1614(auVar148 << 0x18,2) << 0x10;
          auVar360._0_14_ = auVar466._0_14_;
          auVar360[0xe] = bVar13;
          auVar360[0xf] = puVar6[1];
          auVar359._14_2_ = auVar360._14_2_;
          auVar359._0_13_ = auVar466._0_13_;
          auVar359[0xd] = bVar111;
          auVar358._13_3_ = auVar359._13_3_;
          auVar358._0_12_ = auVar466._0_12_;
          auVar358[0xc] = bVar99;
          auVar357._12_4_ = auVar358._12_4_;
          auVar357._0_11_ = auVar466._0_11_;
          auVar357[0xb] = puVar4[1];
          auVar356._11_5_ = auVar357._11_5_;
          auVar356._0_10_ = auVar466._0_10_;
          auVar356[10] = puVar3[1];
          auVar355._10_6_ = auVar356._10_6_;
          auVar355._0_9_ = auVar466._0_9_;
          auVar355[9] = puVar2[1];
          auVar354._9_7_ = auVar355._9_7_;
          auVar354._0_8_ = auVar466._0_8_;
          auVar354[8] = auVar441[1];
          auVar157._1_8_ = auVar354._8_8_;
          auVar157[0] = *puVar6;
          auVar157._9_7_ = 0;
          auVar156._10_6_ = 0;
          auVar156._0_10_ = SUB1610(auVar157 << 0x38,6);
          auVar155._11_5_ = 0;
          auVar155._0_11_ = SUB1611(auVar156 << 0x30,5);
          auVar154._12_4_ = 0;
          auVar154._0_12_ = SUB1612(auVar155 << 0x28,4);
          auVar153._13_3_ = 0;
          auVar153._0_13_ = SUB1613(auVar154 << 0x20,3);
          auVar353._14_2_ = 0;
          auVar353._0_14_ = SUB1614(auVar153 << 0x18,2);
          auVar353 = auVar353 << 0x10;
          auVar162._1_8_ =
               (long)(CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(bVar133,bVar125
                                                                                    ),bVar114),
                                                                   bVar102),puVar4[5]),puVar3[5]),
                                        puVar2[5]),CONCAT11(bVar464,bVar125)) >> 8);
          auVar162[0] = puVar6[4];
          auVar162._9_7_ = 0;
          auVar161._10_6_ = 0;
          auVar161._0_10_ = SUB1610(auVar162 << 0x38,6);
          auVar160._11_5_ = 0;
          auVar160._0_11_ = SUB1611(auVar161 << 0x30,5);
          auVar159._12_4_ = 0;
          auVar159._0_12_ = SUB1612(auVar160 << 0x28,4);
          auVar158._13_3_ = 0;
          auVar158._0_13_ = SUB1613(auVar159 << 0x20,3);
          auVar483._14_2_ = 0;
          auVar483._0_14_ = SUB1614(auVar158 << 0x18,2);
          auVar483 = auVar483 << 0x10;
          auVar388[0xe] = pbVar5[9];
          auVar388[0xf] = puVar6[9];
          auVar167._1_8_ =
               (long)(CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(bVar135,bVar132
                                                                                    ),bVar128),
                                                                   bVar123),bVar118),bVar112),
                                        bVar106),CONCAT11(bVar100,bVar132)) >> 8);
          auVar167[0] = puVar4[10];
          auVar167._9_7_ = 0;
          auVar166._10_6_ = 0;
          auVar166._0_10_ = SUB1610(auVar167 << 0x38,6);
          auVar165._11_5_ = 0;
          auVar165._0_11_ = SUB1611(auVar166 << 0x30,5);
          auVar164._12_4_ = 0;
          auVar164._0_12_ = SUB1612(auVar165 << 0x28,4);
          auVar163._13_3_ = 0;
          auVar163._0_13_ = SUB1613(auVar164 << 0x20,3);
          auVar474._14_2_ = 0;
          auVar474._0_14_ = SUB1614(auVar163 << 0x18,2);
          auVar474 = auVar474 << 0x10;
          auVar172._1_8_ =
               (long)(CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(bVar137,bVar134
                                                                                    ),bVar131),
                                                                   bVar126),bVar121),bVar115),
                                        bVar109),CONCAT11(bVar103,bVar134)) >> 8);
          auVar172[0] = puVar4[0xe];
          auVar172._9_7_ = 0;
          auVar171._10_6_ = 0;
          auVar171._0_10_ = SUB1610(auVar172 << 0x38,6);
          auVar170._11_5_ = 0;
          auVar170._0_11_ = SUB1611(auVar171 << 0x30,5);
          auVar169._12_4_ = 0;
          auVar169._0_12_ = SUB1612(auVar170 << 0x28,4);
          auVar168._13_3_ = 0;
          auVar168._0_13_ = SUB1613(auVar169 << 0x20,3);
          auVar451._14_2_ = 0;
          auVar451._0_14_ = SUB1614(auVar168 << 0x18,2);
          auVar451 = auVar451 << 0x10;
          auVar500._0_14_ = auVar353._0_14_;
          auVar500[0xe] = *puVar6;
          auVar500[0xf] = puVar6[8];
          auVar499._14_2_ = auVar500._14_2_;
          auVar499._0_13_ = auVar353._0_13_;
          auVar499[0xd] = bVar127;
          auVar498._13_3_ = auVar499._13_3_;
          auVar498._0_12_ = auVar353._0_12_;
          auVar498[0xc] = bVar122;
          auVar497._12_4_ = auVar498._12_4_;
          auVar497._0_11_ = auVar353._0_11_;
          auVar497[0xb] = bVar116;
          auVar496._11_5_ = auVar497._11_5_;
          auVar496._0_10_ = auVar353._0_10_;
          auVar496[10] = bVar110;
          auVar495._10_6_ = auVar496._10_6_;
          auVar495._0_9_ = auVar353._0_9_;
          auVar495[9] = bVar104;
          auVar494._9_7_ = auVar495._9_7_;
          auVar494._0_8_ = auVar353._0_8_;
          auVar494[8] = bVar98;
          auVar177._1_8_ = auVar494._8_8_;
          auVar177[0] = puVar4[8];
          auVar177._9_7_ = 0;
          auVar176._10_6_ = 0;
          auVar176._0_10_ = SUB1610(auVar177 << 0x38,6);
          auVar175._11_5_ = 0;
          auVar175._0_11_ = SUB1611(auVar176 << 0x30,5);
          auVar174._12_4_ = 0;
          auVar174._0_12_ = SUB1612(auVar175 << 0x28,4);
          auVar173._13_3_ = 0;
          auVar173._0_13_ = SUB1613(auVar174 << 0x20,3);
          auVar493._14_2_ = 0;
          auVar493._0_14_ = SUB1614(auVar173 << 0x18,2);
          auVar493 = auVar493 << 0x10;
          uVar279 = CONCAT12(bVar105,CONCAT11(bVar99,uVar96));
          uVar314 = CONCAT13(bVar111,uVar279);
          uVar316 = CONCAT14(bVar117,uVar314);
          auVar327[5] = bVar13;
          auVar327._0_5_ = uVar316;
          auVar517._0_14_ = auVar483._0_14_;
          auVar517[0xe] = puVar6[4];
          auVar517[0xf] = puVar6[0xc];
          auVar516._14_2_ = auVar517._14_2_;
          auVar516._0_13_ = auVar483._0_13_;
          auVar516[0xd] = bVar129;
          auVar515._13_3_ = auVar516._13_3_;
          auVar515._0_12_ = auVar483._0_12_;
          auVar515[0xc] = bVar124;
          auVar514._12_4_ = auVar515._12_4_;
          auVar514._0_11_ = auVar483._0_11_;
          auVar514[0xb] = bVar119;
          auVar513._11_5_ = auVar514._11_5_;
          auVar513._0_10_ = auVar483._0_10_;
          auVar513[10] = bVar113;
          auVar512._10_6_ = auVar513._10_6_;
          auVar512._0_9_ = auVar483._0_9_;
          auVar512[9] = bVar107;
          auVar511._9_7_ = auVar512._9_7_;
          auVar511._0_8_ = auVar483._0_8_;
          auVar511[8] = bVar101;
          auVar182._1_8_ = auVar511._8_8_;
          auVar182[0] = puVar4[0xc];
          auVar182._9_7_ = 0;
          auVar181._10_6_ = 0;
          auVar181._0_10_ = SUB1610(auVar182 << 0x38,6);
          auVar180._11_5_ = 0;
          auVar180._0_11_ = SUB1611(auVar181 << 0x30,5);
          auVar179._12_4_ = 0;
          auVar179._0_12_ = SUB1612(auVar180 << 0x28,4);
          auVar178._13_3_ = 0;
          auVar178._0_13_ = SUB1613(auVar179 << 0x20,3);
          auVar510._14_2_ = 0;
          auVar510._0_14_ = SUB1614(auVar178 << 0x18,2);
          auVar510 = auVar510 << 0x10;
          uVar280 = CONCAT12(bVar108,CONCAT11(bVar102,uVar97));
          uVar315 = CONCAT13(bVar114,uVar280);
          uVar317 = CONCAT14(bVar120,uVar315);
          auVar329[5] = bVar125;
          auVar329._0_5_ = uVar317;
          auVar39[0xd] = 0;
          auVar39._0_13_ = auVar493._0_13_;
          auVar39[0xe] = puVar4[8];
          uVar393 = auVar39._13_2_;
          auVar48[0xc] = *puVar4;
          auVar48._0_12_ = auVar493._0_12_;
          auVar48._13_2_ = uVar393;
          auVar63[0xb] = 0;
          auVar63._0_11_ = auVar493._0_11_;
          auVar63._12_3_ = auVar48._12_3_;
          auVar72[10] = puVar3[8];
          auVar72._0_10_ = auVar493._0_10_;
          auVar72._11_4_ = auVar63._11_4_;
          auVar87[9] = 0;
          auVar87._0_9_ = auVar493._0_9_;
          auVar87._10_5_ = auVar72._10_5_;
          auVar95[8] = *puVar3;
          auVar95._0_8_ = auVar493._0_8_;
          auVar95._9_6_ = auVar87._9_6_;
          auVar183._7_8_ = 0;
          auVar183._0_7_ = auVar95._8_7_;
          Var184 = CONCAT81(SUB158(auVar183 << 0x40,7),puVar2[8]);
          auVar281._9_6_ = 0;
          auVar281._0_9_ = Var184;
          auVar185._1_10_ = SUB1510(auVar281 << 0x30,5);
          auVar185[0] = *puVar2;
          auVar282._11_4_ = 0;
          auVar282._0_11_ = auVar185;
          auVar186._1_12_ = SUB1512(auVar282 << 0x20,3);
          auVar186[0] = auVar441[8];
          auVar327._6_8_ = 0;
          auVar25[0xe] = uVar96;
          auVar25._0_14_ = auVar327 << 0x38;
          uVar328 = CONCAT26(auVar25._13_2_,CONCAT15(puVar4[1],uVar316));
          auVar318._4_8_ = 0;
          auVar318._0_4_ = uVar314;
          auVar49._12_3_ = (int3)((ulong)uVar328 >> 0x28);
          auVar49._0_12_ = auVar318 << 0x38;
          uVar319 = CONCAT44(auVar49._11_4_,CONCAT13(puVar3[9],uVar279));
          auVar73._10_5_ = (int5)((ulong)uVar319 >> 0x18);
          auVar73._0_10_ = (unkuint10)CONCAT11(bVar99,uVar96) << 0x38;
          uVar283 = CONCAT62(auVar73._9_6_,CONCAT11(puVar3[1],uVar96));
          auVar187._7_8_ = 0;
          auVar187._0_7_ = (uint7)((ulong)uVar283 >> 8);
          Var188 = CONCAT81(SUB158(auVar187 << 0x40,7),puVar2[9]);
          auVar284._9_6_ = 0;
          auVar284._0_9_ = Var188;
          auVar189._1_10_ = SUB1510(auVar284 << 0x30,5);
          auVar189[0] = puVar2[1];
          auVar285._11_4_ = 0;
          auVar285._0_11_ = auVar189;
          auVar190._1_12_ = SUB1512(auVar285 << 0x20,3);
          auVar190[0] = auVar441[9];
          auVar26[0xd] = 0;
          auVar26._0_13_ = auVar474._0_13_;
          auVar26[0xe] = puVar4[10];
          auVar40[0xc] = puVar4[2];
          auVar40._0_12_ = auVar474._0_12_;
          auVar40._13_2_ = auVar26._13_2_;
          auVar50[0xb] = 0;
          auVar50._0_11_ = auVar474._0_11_;
          auVar50._12_3_ = auVar40._12_3_;
          auVar64[10] = puVar3[10];
          auVar64._0_10_ = auVar474._0_10_;
          auVar64._11_4_ = auVar50._11_4_;
          auVar74[9] = 0;
          auVar74._0_9_ = auVar474._0_9_;
          auVar74._10_5_ = auVar64._10_5_;
          auVar88[8] = puVar3[2];
          auVar88._0_8_ = auVar474._0_8_;
          auVar88._9_6_ = auVar74._9_6_;
          auVar191._7_8_ = 0;
          auVar191._0_7_ = auVar88._8_7_;
          Var192 = CONCAT81(SUB158(auVar191 << 0x40,7),puVar2[10]);
          auVar286._9_6_ = 0;
          auVar286._0_9_ = Var192;
          auVar193._1_10_ = SUB1510(auVar286 << 0x30,5);
          auVar193[0] = puVar2[2];
          auVar287._11_4_ = 0;
          auVar287._0_11_ = auVar193;
          auVar194._1_12_ = SUB1512(auVar287 << 0x20,3);
          auVar194[0] = auVar441[10];
          local_a8 = auVar346._0_2_;
          sStack_a6 = auVar346._2_2_;
          sVar345 = (short)Var184;
          local_d8 = auVar347._0_2_;
          sStack_d6 = auVar347._2_2_;
          local_e8 = auVar348._0_2_;
          sStack_e6 = auVar348._2_2_;
          sVar392 = (short)Var192;
          uVar397 = auVar26._13_2_ >> 8;
          uVar385 = (ushort)(local_e8 * (ushort)bVar461 +
                            (ushort)auVar441[1] * local_d8 + local_a8 * (ushort)auVar441[0]) >> 8;
          uVar389 = (ushort)(sStack_e6 * auVar194._0_2_ +
                            auVar190._0_2_ * sStack_d6 + sStack_a6 * auVar186._0_2_) >> 8;
          uVar394 = (ushort)(local_e8 * auVar193._0_2_ +
                            auVar189._0_2_ * local_d8 + local_a8 * auVar185._0_2_) >> 8;
          uVar398 = (ushort)(sStack_e6 * sVar392 + (short)Var188 * sStack_d6 + sStack_a6 * sVar345)
                    >> 8;
          uVar402 = (ushort)(local_e8 * auVar88._8_2_ +
                            (short)((ulong)uVar283 >> 8) * local_d8 + local_a8 * auVar95._8_2_) >> 8
          ;
          uVar405 = (ushort)(sStack_e6 * auVar64._10_2_ +
                            (short)((ulong)uVar319 >> 0x18) * sStack_d6 + sStack_a6 * auVar72._10_2_
                            ) >> 8;
          uVar408 = (ushort)(local_e8 * auVar40._12_2_ +
                            (short)((ulong)uVar328 >> 0x28) * local_d8 + local_a8 * auVar48._12_2_)
                    >> 8;
          uVar411 = (ushort)(sStack_e6 * uVar397 +
                            (auVar25._13_2_ >> 8) * sStack_d6 + sStack_a6 * (uVar393 >> 8)) >> 8;
          auVar27[0xd] = 0;
          auVar27._0_13_ = auVar510._0_13_;
          auVar27[0xe] = puVar4[0xc];
          auVar41[0xc] = puVar4[4];
          auVar41._0_12_ = auVar510._0_12_;
          auVar41._13_2_ = auVar27._13_2_;
          auVar51[0xb] = 0;
          auVar51._0_11_ = auVar510._0_11_;
          auVar51._12_3_ = auVar41._12_3_;
          auVar65[10] = puVar3[0xc];
          auVar65._0_10_ = auVar510._0_10_;
          auVar65._11_4_ = auVar51._11_4_;
          auVar75[9] = 0;
          auVar75._0_9_ = auVar510._0_9_;
          auVar75._10_5_ = auVar65._10_5_;
          auVar89[8] = puVar3[4];
          auVar89._0_8_ = auVar510._0_8_;
          auVar89._9_6_ = auVar75._9_6_;
          auVar195._7_8_ = 0;
          auVar195._0_7_ = auVar89._8_7_;
          Var184 = CONCAT81(SUB158(auVar195 << 0x40,7),puVar2[0xc]);
          auVar288._9_6_ = 0;
          auVar288._0_9_ = Var184;
          auVar196._1_10_ = SUB1510(auVar288 << 0x30,5);
          auVar196[0] = puVar2[4];
          auVar289._11_4_ = 0;
          auVar289._0_11_ = auVar196;
          auVar197._1_12_ = SUB1512(auVar289 << 0x20,3);
          auVar197[0] = auVar441[0xc];
          auVar329._6_8_ = 0;
          auVar28[0xe] = uVar97;
          auVar28._0_14_ = auVar329 << 0x38;
          uVar328 = CONCAT26(auVar28._13_2_,CONCAT15(puVar4[5],uVar317));
          auVar320._4_8_ = 0;
          auVar320._0_4_ = uVar315;
          auVar52._12_3_ = (int3)((ulong)uVar328 >> 0x28);
          auVar52._0_12_ = auVar320 << 0x38;
          uVar319 = CONCAT44(auVar52._11_4_,CONCAT13(puVar3[0xd],uVar280));
          auVar76._10_5_ = (int5)((ulong)uVar319 >> 0x18);
          auVar76._0_10_ = (unkuint10)CONCAT11(bVar102,uVar97) << 0x38;
          uVar283 = CONCAT62(auVar76._9_6_,CONCAT11(puVar3[5],uVar97));
          auVar198._7_8_ = 0;
          auVar198._0_7_ = (uint7)((ulong)uVar283 >> 8);
          Var188 = CONCAT81(SUB158(auVar198 << 0x40,7),puVar2[0xd]);
          auVar290._9_6_ = 0;
          auVar290._0_9_ = Var188;
          auVar199._1_10_ = SUB1510(auVar290 << 0x30,5);
          auVar199[0] = puVar2[5];
          auVar291._11_4_ = 0;
          auVar291._0_11_ = auVar199;
          auVar200._1_12_ = SUB1512(auVar291 << 0x20,3);
          auVar200[0] = auVar441[0xd];
          auVar29[0xd] = 0;
          auVar29._0_13_ = auVar451._0_13_;
          auVar29[0xe] = puVar4[0xe];
          auVar42[0xc] = puVar4[6];
          auVar42._0_12_ = auVar451._0_12_;
          auVar42._13_2_ = auVar29._13_2_;
          auVar53[0xb] = 0;
          auVar53._0_11_ = auVar451._0_11_;
          auVar53._12_3_ = auVar42._12_3_;
          auVar66[10] = puVar3[0xe];
          auVar66._0_10_ = auVar451._0_10_;
          auVar66._11_4_ = auVar53._11_4_;
          auVar77[9] = 0;
          auVar77._0_9_ = auVar451._0_9_;
          auVar77._10_5_ = auVar66._10_5_;
          auVar90[8] = puVar3[6];
          auVar90._0_8_ = auVar451._0_8_;
          auVar90._9_6_ = auVar77._9_6_;
          auVar201._7_8_ = 0;
          auVar201._0_7_ = auVar90._8_7_;
          Var192 = CONCAT81(SUB158(auVar201 << 0x40,7),puVar2[0xe]);
          auVar292._9_6_ = 0;
          auVar292._0_9_ = Var192;
          auVar202._1_10_ = SUB1510(auVar292 << 0x30,5);
          auVar202[0] = puVar2[6];
          auVar293._11_4_ = 0;
          auVar293._0_11_ = auVar202;
          auVar203._1_12_ = SUB1512(auVar293 << 0x20,3);
          auVar203[0] = auVar441[0xe];
          sVar477 = (short)Var184;
          uVar401 = auVar27._13_2_ >> 8;
          sVar478 = (short)Var192;
          uVar418 = auVar29._13_2_ >> 8;
          uVar368 = (ushort)(local_e8 * (ushort)bVar463 +
                            (ushort)bVar464 * local_d8 + local_a8 * (ushort)bVar462) >> 8;
          uVar377 = (ushort)(sStack_e6 * auVar203._0_2_ +
                            auVar200._0_2_ * sStack_d6 + sStack_a6 * auVar197._0_2_) >> 8;
          uVar378 = (ushort)(local_e8 * auVar202._0_2_ +
                            auVar199._0_2_ * local_d8 + local_a8 * auVar196._0_2_) >> 8;
          uVar379 = (ushort)(sStack_e6 * sVar478 + (short)Var188 * sStack_d6 + sStack_a6 * sVar477)
                    >> 8;
          uVar380 = (ushort)(local_e8 * auVar90._8_2_ +
                            (short)((ulong)uVar283 >> 8) * local_d8 + local_a8 * auVar89._8_2_) >> 8
          ;
          uVar381 = (ushort)(sStack_e6 * auVar66._10_2_ +
                            (short)((ulong)uVar319 >> 0x18) * sStack_d6 + sStack_a6 * auVar65._10_2_
                            ) >> 8;
          uVar382 = (ushort)(local_e8 * auVar42._12_2_ +
                            (short)((ulong)uVar328 >> 0x28) * local_d8 + local_a8 * auVar41._12_2_)
                    >> 8;
          uVar383 = (ushort)(sStack_e6 * uVar418 +
                            (auVar28._13_2_ >> 8) * sStack_d6 + sStack_a6 * uVar401) >> 8;
          local_b8 = auVar349._0_2_;
          sStack_b6 = auVar349._2_2_;
          local_f8 = auVar350._0_2_;
          sStack_f6 = auVar350._2_2_;
          sVar386 = ((ushort)(uVar385 * local_b8) >> 7) + local_f8;
          sVar390 = ((ushort)(uVar389 * sStack_b6) >> 7) + sStack_f6;
          sVar395 = ((ushort)(uVar394 * local_b8) >> 7) + local_f8;
          sVar399 = ((ushort)(uVar398 * sStack_b6) >> 7) + sStack_f6;
          sVar403 = ((ushort)(uVar402 * local_b8) >> 7) + local_f8;
          sVar406 = ((ushort)(uVar405 * sStack_b6) >> 7) + sStack_f6;
          sVar409 = ((ushort)(uVar408 * local_b8) >> 7) + local_f8;
          sVar412 = ((ushort)(uVar411 * sStack_b6) >> 7) + sStack_f6;
          sVar414 = ((ushort)(uVar368 * local_b8) >> 7) + local_f8;
          sVar415 = ((ushort)(uVar377 * sStack_b6) >> 7) + sStack_f6;
          sVar416 = ((ushort)(uVar378 * local_b8) >> 7) + local_f8;
          sVar417 = ((ushort)(uVar379 * sStack_b6) >> 7) + sStack_f6;
          sVar419 = ((ushort)(uVar380 * local_b8) >> 7) + local_f8;
          sVar420 = ((ushort)(uVar381 * sStack_b6) >> 7) + sStack_f6;
          sVar421 = ((ushort)(uVar382 * local_b8) >> 7) + local_f8;
          sVar422 = ((ushort)(uVar383 * sStack_b6) >> 7) + sStack_f6;
          bVar464 = (0 < sVar386) * (sVar386 < 0x100) * (char)sVar386 - (0xff < sVar386);
          cVar7 = (0 < sVar390) * (sVar390 < 0x100) * (char)sVar390 - (0xff < sVar390);
          cVar8 = (0 < sVar395) * (sVar395 < 0x100) * (char)sVar395 - (0xff < sVar395);
          cVar9 = (0 < sVar399) * (sVar399 < 0x100) * (char)sVar399 - (0xff < sVar399);
          cVar10 = (0 < sVar403) * (sVar403 < 0x100) * (char)sVar403 - (0xff < sVar403);
          cVar11 = (0 < sVar406) * (sVar406 < 0x100) * (char)sVar406 - (0xff < sVar406);
          cVar12 = (0 < sVar409) * (sVar409 < 0x100) * (char)sVar409 - (0xff < sVar409);
          bVar13 = (0 < sVar412) * (sVar412 < 0x100) * (char)sVar412 - (0xff < sVar412);
          bVar14 = (0 < sVar414) * (sVar414 < 0x100) * (char)sVar414 - (0xff < sVar414);
          bVar15 = (0 < sVar415) * (sVar415 < 0x100) * (char)sVar415 - (0xff < sVar415);
          uVar279 = CONCAT12(bVar15,CONCAT11(bVar14,bVar13));
          bVar16 = (0 < sVar416) * (sVar416 < 0x100) * (char)sVar416 - (0xff < sVar416);
          uVar314 = CONCAT13(bVar16,uVar279);
          bVar17 = (0 < sVar417) * (sVar417 < 0x100) * (char)sVar417 - (0xff < sVar417);
          uVar316 = CONCAT14(bVar17,uVar314);
          bVar18 = (0 < sVar419) * (sVar419 < 0x100) * (char)sVar419 - (0xff < sVar419);
          auVar330[5] = bVar18;
          auVar330._0_5_ = uVar316;
          bVar19 = (0 < sVar420) * (sVar420 < 0x100) * (char)sVar420 - (0xff < sVar420);
          bVar20 = (0 < sVar421) * (sVar421 < 0x100) * (char)sVar421 - (0xff < sVar421);
          bVar21 = (0 < sVar422) * (sVar422 < 0x100) * (char)sVar422 - (0xff < sVar422);
          auVar330._6_8_ = 0;
          auVar30[0xe] = bVar13;
          auVar30._0_14_ = auVar330 << 0x38;
          uVar328 = CONCAT26(auVar30._13_2_,CONCAT15(cVar12,uVar316));
          auVar321._4_8_ = 0;
          auVar321._0_4_ = uVar314;
          auVar54._12_3_ = (int3)((ulong)uVar328 >> 0x28);
          auVar54._0_12_ = auVar321 << 0x38;
          uVar319 = CONCAT44(auVar54._11_4_,CONCAT13(cVar11,uVar279));
          auVar78._10_5_ = (int5)((ulong)uVar319 >> 0x18);
          auVar78._0_10_ = (unkuint10)CONCAT11(bVar14,bVar13) << 0x38;
          uVar283 = CONCAT62(auVar78._9_6_,CONCAT11(cVar10,bVar13));
          auVar204._7_8_ = 0;
          auVar204._0_7_ = (uint7)((ulong)uVar283 >> 8);
          Var184 = CONCAT81(SUB158(auVar204 << 0x40,7),cVar9);
          auVar294._9_6_ = 0;
          auVar294._0_9_ = Var184;
          auVar205._1_10_ = SUB1510(auVar294 << 0x30,5);
          auVar205[0] = cVar8;
          auVar295._11_4_ = 0;
          auVar295._0_11_ = auVar205;
          auVar206._1_12_ = SUB1512(auVar295 << 0x20,3);
          auVar206[0] = cVar7;
          sVar386 = (short)((ulong)uVar283 >> 8);
          sVar390 = (short)((ulong)uVar319 >> 0x18);
          sVar395 = (short)((ulong)uVar328 >> 0x28);
          uVar362 = (ushort)Var184;
          uVar361 = auVar205._0_2_;
          uVar344 = auVar206._0_2_;
          puVar2 = Y + lVar337 * 2 + uVar342;
          *puVar2 = (bVar464 != 0) * (bVar464 < 0x100) * bVar464 - (0xff < bVar464);
          puVar2[1] = (bVar14 != 0) * (bVar14 < 0x100) * bVar14 - (0xff < bVar14);
          puVar2[2] = (uVar344 != 0) * (uVar344 < 0x100) * cVar7 - (0xff < uVar344);
          puVar2[3] = (bVar15 != 0) * (bVar15 < 0x100) * bVar15 - (0xff < bVar15);
          puVar2[4] = (uVar361 != 0) * (uVar361 < 0x100) * cVar8 - (0xff < uVar361);
          puVar2[5] = (bVar16 != 0) * (bVar16 < 0x100) * bVar16 - (0xff < bVar16);
          puVar2[6] = (uVar362 != 0) * (uVar362 < 0x100) * cVar9 - (0xff < uVar362);
          puVar2[7] = (bVar17 != 0) * (bVar17 < 0x100) * bVar17 - (0xff < bVar17);
          puVar2[8] = (0 < sVar386) * (sVar386 < 0x100) * cVar10 - (0xff < sVar386);
          puVar2[9] = (bVar18 != 0) * (bVar18 < 0x100) * bVar18 - (0xff < bVar18);
          puVar2[10] = (0 < sVar390) * (sVar390 < 0x100) * cVar11 - (0xff < sVar390);
          puVar2[0xb] = (bVar19 != 0) * (bVar19 < 0x100) * bVar19 - (0xff < bVar19);
          puVar2[0xc] = (0 < sVar395) * (sVar395 < 0x100) * cVar12 - (0xff < sVar395);
          puVar2[0xd] = (bVar20 != 0) * (bVar20 < 0x100) * bVar20 - (0xff < bVar20);
          puVar2[0xe] = (bVar13 != 0) * (bVar13 < 0x100) * bVar13 - (0xff < bVar13);
          puVar2[0xf] = (bVar21 != 0) * (bVar21 < 0x100) * bVar21 - (0xff < bVar21);
          uVar387 = (ushort)(local_e8 * (ushort)bVar100 +
                            (ushort)bVar99 * local_d8 + local_a8 * (ushort)bVar98) >> 8;
          uVar391 = (ushort)(sStack_e6 * (ushort)bVar106 +
                            (ushort)bVar105 * sStack_d6 + sStack_a6 * (ushort)bVar104) >> 8;
          uVar396 = (ushort)(local_e8 * (ushort)bVar112 +
                            (ushort)bVar111 * local_d8 + local_a8 * (ushort)bVar110) >> 8;
          uVar400 = (ushort)(sStack_e6 * (ushort)bVar118 +
                            (ushort)bVar117 * sStack_d6 + sStack_a6 * (ushort)bVar116) >> 8;
          uVar404 = (ushort)(local_e8 * (ushort)bVar123 +
                            (auVar359._14_2_ & 0xff) * local_d8 + local_a8 * (ushort)bVar122) >> 8;
          uVar407 = (ushort)(sStack_e6 * (ushort)bVar128 +
                            (auVar388._14_2_ & 0xff) * sStack_d6 + sStack_a6 * (ushort)bVar127) >> 8
          ;
          uVar410 = (ushort)(local_e8 * (ushort)bVar132 +
                            (auVar359._14_2_ >> 8) * local_d8 + local_a8 * (auVar499._14_2_ & 0xff))
                    >> 8;
          uVar413 = (ushort)(sStack_e6 * (ushort)bVar135 +
                            (auVar388._14_2_ >> 8) * sStack_d6 + sStack_a6 * (auVar499._14_2_ >> 8))
                    >> 8;
          uVar344 = (ushort)(local_e8 * (ushort)bVar103 +
                            (ushort)bVar102 * local_d8 + local_a8 * (ushort)bVar101) >> 8;
          uVar361 = (ushort)(sStack_e6 * (ushort)bVar109 +
                            (ushort)bVar108 * sStack_d6 + sStack_a6 * (ushort)bVar107) >> 8;
          uVar362 = (ushort)(local_e8 * (ushort)bVar115 +
                            (ushort)bVar114 * local_d8 + local_a8 * (ushort)bVar113) >> 8;
          uVar363 = (ushort)(sStack_e6 * (ushort)bVar121 +
                            (ushort)bVar120 * sStack_d6 + sStack_a6 * (ushort)bVar119) >> 8;
          uVar364 = (ushort)(local_e8 * (ushort)bVar126 +
                            (ushort)bVar125 * local_d8 + local_a8 * (ushort)bVar124) >> 8;
          uVar365 = (ushort)(sStack_e6 * (ushort)bVar131 +
                            (ushort)bVar130 * sStack_d6 + sStack_a6 * (ushort)bVar129) >> 8;
          uVar366 = (ushort)(local_e8 * (ushort)bVar134 +
                            (ushort)bVar133 * local_d8 + local_a8 * (auVar516._14_2_ & 0xff)) >> 8;
          uVar367 = (ushort)(sStack_e6 * (ushort)bVar137 +
                            (ushort)bVar136 * sStack_d6 + sStack_a6 * (auVar516._14_2_ >> 8)) >> 8;
          sVar386 = uVar368 + uVar385 + uVar344 + uVar387;
          sVar390 = uVar377 + uVar389 + uVar361 + uVar391;
          sVar395 = uVar378 + uVar394 + uVar362 + uVar396;
          sVar399 = uVar379 + uVar398 + uVar363 + uVar400;
          sVar403 = uVar380 + uVar402 + uVar364 + uVar404;
          sVar406 = uVar381 + uVar405 + uVar365 + uVar407;
          sVar409 = uVar382 + uVar408 + uVar366 + uVar410;
          sVar412 = uVar383 + uVar411 + uVar367 + uVar413;
          auVar440._0_2_ =
               ((ushort)bVar463 + (ushort)bVar461 + (ushort)bVar103 + (ushort)bVar100) - sVar386;
          auVar440._2_2_ =
               (auVar203._0_2_ + auVar194._0_2_ + (ushort)bVar109 + (ushort)bVar106) - sVar390;
          auVar440._4_2_ =
               (auVar202._0_2_ + auVar193._0_2_ + (ushort)bVar115 + (ushort)bVar112) - sVar395;
          auVar440._6_2_ = (sVar478 + sVar392 + (ushort)bVar121 + (ushort)bVar118) - sVar399;
          auVar440._8_2_ =
               (auVar90._8_2_ + auVar88._8_2_ + (ushort)bVar126 + (ushort)bVar123) - sVar403;
          auVar440._10_2_ =
               (auVar66._10_2_ + auVar64._10_2_ + (ushort)bVar131 + (ushort)bVar128) - sVar406;
          auVar440._12_2_ =
               (auVar42._12_2_ + auVar40._12_2_ + (ushort)bVar134 + (ushort)bVar132) - sVar409;
          auVar440._14_2_ = (uVar418 + uVar397 + (ushort)bVar137 + (ushort)bVar135) - sVar412;
          local_c8._2_2_ =
               (auVar197._0_2_ + auVar186._0_2_ + (ushort)bVar107 + (ushort)bVar104) - sVar390;
          local_c8._0_2_ =
               ((ushort)bVar462 + (ushort)auVar441[0] + (ushort)bVar101 + (ushort)bVar98) - sVar386;
          local_c8._4_2_ =
               (auVar196._0_2_ + auVar185._0_2_ + (ushort)bVar113 + (ushort)bVar110) - sVar395;
          local_c8._6_2_ = (sVar477 + sVar345 + (ushort)bVar119 + (ushort)bVar116) - sVar399;
          local_c8._8_2_ =
               (auVar89._8_2_ + auVar95._8_2_ + (ushort)bVar124 + (ushort)bVar122) - sVar403;
          local_c8._10_2_ =
               (auVar65._10_2_ + auVar72._10_2_ + (ushort)bVar129 + (ushort)bVar127) - sVar406;
          local_c8._12_2_ =
               (auVar41._12_2_ + auVar48._12_2_ +
               (auVar516._14_2_ & 0xff) + (auVar499._14_2_ & 0xff)) - sVar409;
          local_c8._14_2_ =
               (uVar401 + (uVar393 >> 8) + (auVar516._14_2_ >> 8) + (auVar499._14_2_ >> 8)) -
               sVar412;
          sVar412 = ((ushort)(uVar387 * local_b8) >> 7) + local_f8;
          sVar392 = ((ushort)(uVar391 * sStack_b6) >> 7) + sStack_f6;
          sVar414 = ((ushort)(uVar396 * local_b8) >> 7) + local_f8;
          sVar415 = ((ushort)(uVar400 * sStack_b6) >> 7) + sStack_f6;
          sVar416 = ((ushort)(uVar404 * local_b8) >> 7) + local_f8;
          sVar417 = ((ushort)(uVar407 * sStack_b6) >> 7) + sStack_f6;
          sVar419 = ((ushort)(uVar410 * local_b8) >> 7) + local_f8;
          sVar420 = ((ushort)(uVar413 * sStack_b6) >> 7) + sStack_f6;
          sVar345 = ((ushort)(uVar344 * local_b8) >> 7) + local_f8;
          sVar386 = ((ushort)(uVar361 * sStack_b6) >> 7) + sStack_f6;
          sVar390 = ((ushort)(uVar362 * local_b8) >> 7) + local_f8;
          sVar395 = ((ushort)(uVar363 * sStack_b6) >> 7) + sStack_f6;
          sVar399 = ((ushort)(uVar364 * local_b8) >> 7) + local_f8;
          sVar403 = ((ushort)(uVar365 * sStack_b6) >> 7) + sStack_f6;
          sVar406 = ((ushort)(uVar366 * local_b8) >> 7) + local_f8;
          sVar409 = ((ushort)(uVar367 * sStack_b6) >> 7) + sStack_f6;
          bVar17 = (0 < sVar412) * (sVar412 < 0x100) * (char)sVar412 - (0xff < sVar412);
          cVar8 = (0 < sVar392) * (sVar392 < 0x100) * (char)sVar392 - (0xff < sVar392);
          cVar9 = (0 < sVar414) * (sVar414 < 0x100) * (char)sVar414 - (0xff < sVar414);
          cVar10 = (0 < sVar415) * (sVar415 < 0x100) * (char)sVar415 - (0xff < sVar415);
          cVar11 = (0 < sVar416) * (sVar416 < 0x100) * (char)sVar416 - (0xff < sVar416);
          cVar12 = (0 < sVar417) * (sVar417 < 0x100) * (char)sVar417 - (0xff < sVar417);
          cVar7 = (0 < sVar419) * (sVar419 < 0x100) * (char)sVar419 - (0xff < sVar419);
          bVar14 = (0 < sVar420) * (sVar420 < 0x100) * (char)sVar420 - (0xff < sVar420);
          bVar15 = (0 < sVar345) * (sVar345 < 0x100) * (char)sVar345 - (0xff < sVar345);
          bVar16 = (0 < sVar386) * (sVar386 < 0x100) * (char)sVar386 - (0xff < sVar386);
          uVar279 = CONCAT12(bVar16,CONCAT11(bVar15,bVar14));
          bVar18 = (0 < sVar390) * (sVar390 < 0x100) * (char)sVar390 - (0xff < sVar390);
          uVar314 = CONCAT13(bVar18,uVar279);
          bVar13 = (0 < sVar395) * (sVar395 < 0x100) * (char)sVar395 - (0xff < sVar395);
          uVar316 = CONCAT14(bVar13,uVar314);
          bVar19 = (0 < sVar399) * (sVar399 < 0x100) * (char)sVar399 - (0xff < sVar399);
          auVar331[5] = bVar19;
          auVar331._0_5_ = uVar316;
          bVar20 = (0 < sVar403) * (sVar403 < 0x100) * (char)sVar403 - (0xff < sVar403);
          bVar21 = (0 < sVar406) * (sVar406 < 0x100) * (char)sVar406 - (0xff < sVar406);
          bVar464 = (0 < sVar409) * (sVar409 < 0x100) * (char)sVar409 - (0xff < sVar409);
          auVar331._6_8_ = 0;
          auVar31[0xe] = bVar14;
          auVar31._0_14_ = auVar331 << 0x38;
          uVar328 = CONCAT26(auVar31._13_2_,CONCAT15(cVar7,uVar316));
          auVar322._4_8_ = 0;
          auVar322._0_4_ = uVar314;
          auVar55._12_3_ = (int3)((ulong)uVar328 >> 0x28);
          auVar55._0_12_ = auVar322 << 0x38;
          uVar319 = CONCAT44(auVar55._11_4_,CONCAT13(cVar12,uVar279));
          auVar79._10_5_ = (int5)((ulong)uVar319 >> 0x18);
          auVar79._0_10_ = (unkuint10)CONCAT11(bVar15,bVar14) << 0x38;
          uVar283 = CONCAT62(auVar79._9_6_,CONCAT11(cVar11,bVar14));
          auVar207._7_8_ = 0;
          auVar207._0_7_ = (uint7)((ulong)uVar283 >> 8);
          Var184 = CONCAT81(SUB158(auVar207 << 0x40,7),cVar10);
          auVar296._9_6_ = 0;
          auVar296._0_9_ = Var184;
          auVar208._1_10_ = SUB1510(auVar296 << 0x30,5);
          auVar208[0] = cVar9;
          auVar297._11_4_ = 0;
          auVar297._0_11_ = auVar208;
          auVar209._1_12_ = SUB1512(auVar297 << 0x20,3);
          auVar209[0] = cVar8;
          sVar345 = (short)((ulong)uVar283 >> 8);
          sVar386 = (short)((ulong)uVar319 >> 0x18);
          sVar390 = (short)((ulong)uVar328 >> 0x28);
          uVar401 = (ushort)Var184;
          uVar397 = auVar208._0_2_;
          uVar393 = auVar209._0_2_;
          puVar2 = Y + lVar337 * 2 + (ulong)Y_stride;
          *puVar2 = (bVar17 != 0) * (bVar17 < 0x100) * bVar17 - (0xff < bVar17);
          puVar2[1] = (bVar15 != 0) * (bVar15 < 0x100) * bVar15 - (0xff < bVar15);
          puVar2[2] = (uVar393 != 0) * (uVar393 < 0x100) * cVar8 - (0xff < uVar393);
          puVar2[3] = (bVar16 != 0) * (bVar16 < 0x100) * bVar16 - (0xff < bVar16);
          puVar2[4] = (uVar397 != 0) * (uVar397 < 0x100) * cVar9 - (0xff < uVar397);
          puVar2[5] = (bVar18 != 0) * (bVar18 < 0x100) * bVar18 - (0xff < bVar18);
          puVar2[6] = (uVar401 != 0) * (uVar401 < 0x100) * cVar10 - (0xff < uVar401);
          puVar2[7] = (bVar13 != 0) * (bVar13 < 0x100) * bVar13 - (0xff < bVar13);
          puVar2[8] = (0 < sVar345) * (sVar345 < 0x100) * cVar11 - (0xff < sVar345);
          puVar2[9] = (bVar19 != 0) * (bVar19 < 0x100) * bVar19 - (0xff < bVar19);
          puVar2[10] = (0 < sVar386) * (sVar386 < 0x100) * cVar12 - (0xff < sVar386);
          puVar2[0xb] = (bVar20 != 0) * (bVar20 < 0x100) * bVar20 - (0xff < bVar20);
          puVar2[0xc] = (0 < sVar390) * (sVar390 < 0x100) * cVar7 - (0xff < sVar390);
          puVar2[0xd] = (bVar21 != 0) * (bVar21 < 0x100) * bVar21 - (0xff < bVar21);
          puVar2[0xe] = (bVar14 != 0) * (bVar14 < 0x100) * bVar14 - (0xff < bVar14);
          puVar2[0xf] = (bVar464 != 0) * (bVar464 < 0x100) * bVar464 - (0xff < bVar464);
          auVar441 = *(undefined1 (*) [16])(RGBA + lVar337 * 8 + uVar339 + 0x40);
          puVar2 = RGBA + lVar337 * 8 + uVar339 + 0x50;
          puVar3 = RGBA + lVar337 * 8 + uVar339 + 0x60;
          puVar4 = RGBA + lVar337 * 8 + uVar339 + 0x70;
          uVar96 = puVar4[9];
          uVar97 = puVar4[0xd];
          pbVar1 = RGBA + lVar337 * 8 + (ulong)RGBA_stride + 0x40;
          bVar98 = *pbVar1;
          bVar99 = pbVar1[1];
          bVar100 = pbVar1[2];
          bVar101 = pbVar1[4];
          bVar102 = pbVar1[5];
          bVar103 = pbVar1[6];
          bVar104 = pbVar1[8];
          bVar105 = pbVar1[9];
          bVar106 = pbVar1[10];
          bVar107 = pbVar1[0xc];
          bVar108 = pbVar1[0xd];
          bVar109 = pbVar1[0xe];
          pbVar5 = RGBA + lVar337 * 8 + (ulong)RGBA_stride + 0x50;
          bVar110 = *pbVar5;
          bVar111 = pbVar5[1];
          bVar112 = pbVar5[2];
          bVar113 = pbVar5[4];
          bVar114 = pbVar5[5];
          bVar115 = pbVar5[6];
          bVar116 = pbVar5[8];
          bVar117 = pbVar5[9];
          bVar118 = pbVar5[10];
          bVar119 = pbVar5[0xc];
          bVar120 = pbVar5[0xd];
          bVar121 = pbVar5[0xe];
          pbVar5 = RGBA + lVar337 * 8 + (ulong)RGBA_stride + 0x60;
          bVar122 = *pbVar5;
          bVar13 = pbVar5[1];
          bVar123 = pbVar5[2];
          bVar124 = pbVar5[4];
          bVar125 = pbVar5[5];
          bVar126 = pbVar5[6];
          bVar127 = pbVar5[8];
          bVar128 = pbVar5[10];
          bVar129 = pbVar5[0xc];
          bVar130 = pbVar5[0xd];
          bVar131 = pbVar5[0xe];
          puVar6 = RGBA + lVar337 * 8 + (ulong)RGBA_stride + 0x70;
          bVar132 = puVar6[2];
          bVar133 = puVar6[5];
          bVar134 = puVar6[6];
          bVar135 = puVar6[10];
          bVar136 = puVar6[0xc];
          bVar137 = puVar6[0xd];
          bVar461 = puVar6[0xe];
          auVar459._0_14_ = auVar441._0_14_;
          auVar459[0xe] = auVar441[7];
          auVar459[0xf] = pbVar1[7];
          auVar458._14_2_ = auVar459._14_2_;
          auVar458._0_13_ = auVar441._0_13_;
          auVar458[0xd] = bVar103;
          bVar465 = auVar441[6];
          auVar457._13_3_ = auVar458._13_3_;
          auVar457._0_12_ = auVar441._0_12_;
          auVar457[0xc] = bVar465;
          auVar456._12_4_ = auVar457._12_4_;
          auVar456._0_11_ = auVar441._0_11_;
          auVar456[0xb] = bVar102;
          bVar464 = auVar441[5];
          auVar455._11_5_ = auVar456._11_5_;
          auVar455._0_10_ = auVar441._0_10_;
          auVar455[10] = bVar464;
          auVar454._10_6_ = auVar455._10_6_;
          auVar454._0_9_ = auVar441._0_9_;
          auVar454[9] = bVar101;
          bVar463 = auVar441[4];
          auVar453._9_7_ = auVar454._9_7_;
          auVar453._0_8_ = auVar441._0_8_;
          auVar453[8] = bVar463;
          auVar214._1_8_ = auVar453._8_8_;
          auVar214[0] = pbVar1[3];
          auVar214._9_7_ = 0;
          auVar213._10_6_ = 0;
          auVar213._0_10_ = SUB1610(auVar214 << 0x38,6);
          bVar462 = auVar441[2];
          auVar212._11_5_ = 0;
          auVar212._0_11_ = SUB1611(auVar213 << 0x30,5);
          auVar211._12_4_ = 0;
          auVar211._0_12_ = SUB1612(auVar212 << 0x28,4);
          auVar210._13_3_ = 0;
          auVar210._0_13_ = SUB1613(auVar211 << 0x20,3);
          auVar452._14_2_ = 0;
          auVar452._0_14_ = SUB1614(auVar210 << 0x18,2);
          auVar452 = auVar452 << 0x10;
          auVar438._0_14_ = auVar452._0_14_;
          auVar438[0xe] = pbVar1[3];
          auVar438[0xf] = pbVar5[3];
          auVar437._14_2_ = auVar438._14_2_;
          auVar437._0_13_ = auVar452._0_13_;
          auVar437[0xd] = puVar3[3];
          auVar436._13_3_ = auVar437._13_3_;
          auVar436._0_12_ = auVar452._0_12_;
          auVar436[0xc] = auVar441[3];
          auVar435._12_4_ = auVar436._12_4_;
          auVar435._0_11_ = auVar452._0_11_;
          auVar435[0xb] = bVar123;
          auVar434._11_5_ = auVar435._11_5_;
          auVar434._0_10_ = auVar452._0_10_;
          auVar434[10] = bVar100;
          auVar433._10_6_ = auVar434._10_6_;
          auVar433._0_9_ = auVar452._0_9_;
          auVar433[9] = puVar3[2];
          auVar432._9_7_ = auVar433._9_7_;
          auVar432._0_8_ = auVar452._0_8_;
          auVar432[8] = bVar462;
          auVar219._1_8_ = auVar432._8_8_;
          auVar219[0] = bVar13;
          auVar219._9_7_ = 0;
          auVar218._10_6_ = 0;
          auVar218._0_10_ = SUB1610(auVar219 << 0x38,6);
          auVar217._11_5_ = 0;
          auVar217._0_11_ = SUB1611(auVar218 << 0x30,5);
          auVar216._12_4_ = 0;
          auVar216._0_12_ = SUB1612(auVar217 << 0x28,4);
          auVar215._13_3_ = 0;
          auVar215._0_13_ = SUB1613(auVar216 << 0x20,3);
          auVar431._14_2_ = 0;
          auVar431._0_14_ = SUB1614(auVar215 << 0x18,2);
          auVar431 = auVar431 << 0x10;
          auVar224._1_8_ =
               (long)(CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(pbVar5[0xb],
                                                                                     pbVar1[0xb]),
                                                                            puVar3[0xb]),
                                                                   auVar441[0xb]),bVar128),bVar106),
                                        puVar3[10]),CONCAT11(auVar441[10],pbVar1[0xb])) >> 8);
          auVar224[0] = pbVar5[9];
          auVar224._9_7_ = 0;
          auVar223._10_6_ = 0;
          auVar223._0_10_ = SUB1610(auVar224 << 0x38,6);
          auVar222._11_5_ = 0;
          auVar222._0_11_ = SUB1611(auVar223 << 0x30,5);
          auVar221._12_4_ = 0;
          auVar221._0_12_ = SUB1612(auVar222 << 0x28,4);
          auVar220._13_3_ = 0;
          auVar220._0_13_ = SUB1613(auVar221 << 0x20,3);
          auVar384._0_14_ = SUB1614(auVar220 << 0x18,2) << 0x10;
          auVar491._0_14_ = auVar431._0_14_;
          auVar491[0xe] = bVar13;
          auVar491[0xf] = puVar6[1];
          auVar490._14_2_ = auVar491._14_2_;
          auVar490._0_13_ = auVar431._0_13_;
          auVar490[0xd] = bVar111;
          auVar489._13_3_ = auVar490._13_3_;
          auVar489._0_12_ = auVar431._0_12_;
          auVar489[0xc] = bVar99;
          auVar488._12_4_ = auVar489._12_4_;
          auVar488._0_11_ = auVar431._0_11_;
          auVar488[0xb] = puVar4[1];
          auVar487._11_5_ = auVar488._11_5_;
          auVar487._0_10_ = auVar431._0_10_;
          auVar487[10] = puVar3[1];
          auVar486._10_6_ = auVar487._10_6_;
          auVar486._0_9_ = auVar431._0_9_;
          auVar486[9] = puVar2[1];
          auVar485._9_7_ = auVar486._9_7_;
          auVar485._0_8_ = auVar431._0_8_;
          auVar485[8] = auVar441[1];
          auVar229._1_8_ = auVar485._8_8_;
          auVar229[0] = *puVar6;
          auVar229._9_7_ = 0;
          auVar228._10_6_ = 0;
          auVar228._0_10_ = SUB1610(auVar229 << 0x38,6);
          auVar227._11_5_ = 0;
          auVar227._0_11_ = SUB1611(auVar228 << 0x30,5);
          auVar226._12_4_ = 0;
          auVar226._0_12_ = SUB1612(auVar227 << 0x28,4);
          auVar225._13_3_ = 0;
          auVar225._0_13_ = SUB1613(auVar226 << 0x20,3);
          auVar484._14_2_ = 0;
          auVar484._0_14_ = SUB1614(auVar225 << 0x18,2);
          auVar484 = auVar484 << 0x10;
          auVar234._1_8_ =
               (long)(CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(bVar133,bVar125
                                                                                    ),bVar114),
                                                                   bVar102),puVar4[5]),puVar3[5]),
                                        puVar2[5]),CONCAT11(bVar464,bVar125)) >> 8);
          auVar234[0] = puVar6[4];
          auVar234._9_7_ = 0;
          auVar233._10_6_ = 0;
          auVar233._0_10_ = SUB1610(auVar234 << 0x38,6);
          auVar232._11_5_ = 0;
          auVar232._0_11_ = SUB1611(auVar233 << 0x30,5);
          auVar231._12_4_ = 0;
          auVar231._0_12_ = SUB1612(auVar232 << 0x28,4);
          auVar230._13_3_ = 0;
          auVar230._0_13_ = SUB1613(auVar231 << 0x20,3);
          auVar518._14_2_ = 0;
          auVar518._0_14_ = SUB1614(auVar230 << 0x18,2);
          auVar518 = auVar518 << 0x10;
          auVar384[0xe] = pbVar5[9];
          auVar384[0xf] = puVar6[9];
          auVar239._1_8_ =
               (long)(CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(bVar135,bVar132
                                                                                    ),bVar128),
                                                                   bVar123),bVar118),bVar112),
                                        bVar106),CONCAT11(bVar100,bVar132)) >> 8);
          auVar239[0] = puVar4[10];
          auVar239._9_7_ = 0;
          auVar238._10_6_ = 0;
          auVar238._0_10_ = SUB1610(auVar239 << 0x38,6);
          auVar237._11_5_ = 0;
          auVar237._0_11_ = SUB1611(auVar238 << 0x30,5);
          auVar236._12_4_ = 0;
          auVar236._0_12_ = SUB1612(auVar237 << 0x28,4);
          auVar235._13_3_ = 0;
          auVar235._0_13_ = SUB1613(auVar236 << 0x20,3);
          auVar439._14_2_ = 0;
          auVar439._0_14_ = SUB1614(auVar235 << 0x18,2);
          auVar439 = auVar439 << 0x10;
          auVar244._1_8_ =
               (long)(CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(bVar461,bVar134
                                                                                    ),bVar131),
                                                                   bVar126),bVar121),bVar115),
                                        bVar109),CONCAT11(bVar103,bVar134)) >> 8);
          auVar244[0] = puVar4[0xe];
          auVar244._9_7_ = 0;
          auVar243._10_6_ = 0;
          auVar243._0_10_ = SUB1610(auVar244 << 0x38,6);
          auVar242._11_5_ = 0;
          auVar242._0_11_ = SUB1611(auVar243 << 0x30,5);
          auVar241._12_4_ = 0;
          auVar241._0_12_ = SUB1612(auVar242 << 0x28,4);
          auVar240._13_3_ = 0;
          auVar240._0_13_ = SUB1613(auVar241 << 0x20,3);
          auVar460._14_2_ = 0;
          auVar460._0_14_ = SUB1614(auVar240 << 0x18,2);
          auVar460 = auVar460 << 0x10;
          auVar376._0_14_ = auVar484._0_14_;
          auVar376[0xe] = *puVar6;
          auVar376[0xf] = puVar6[8];
          auVar375._14_2_ = auVar376._14_2_;
          auVar375._0_13_ = auVar484._0_13_;
          auVar375[0xd] = bVar127;
          auVar374._13_3_ = auVar375._13_3_;
          auVar374._0_12_ = auVar484._0_12_;
          auVar374[0xc] = bVar122;
          auVar373._12_4_ = auVar374._12_4_;
          auVar373._0_11_ = auVar484._0_11_;
          auVar373[0xb] = bVar116;
          auVar372._11_5_ = auVar373._11_5_;
          auVar372._0_10_ = auVar484._0_10_;
          auVar372[10] = bVar110;
          auVar371._10_6_ = auVar372._10_6_;
          auVar371._0_9_ = auVar484._0_9_;
          auVar371[9] = bVar104;
          auVar370._9_7_ = auVar371._9_7_;
          auVar370._0_8_ = auVar484._0_8_;
          auVar370[8] = bVar98;
          auVar249._1_8_ = auVar370._8_8_;
          auVar249[0] = puVar4[8];
          auVar249._9_7_ = 0;
          auVar248._10_6_ = 0;
          auVar248._0_10_ = SUB1610(auVar249 << 0x38,6);
          auVar247._11_5_ = 0;
          auVar247._0_11_ = SUB1611(auVar248 << 0x30,5);
          auVar246._12_4_ = 0;
          auVar246._0_12_ = SUB1612(auVar247 << 0x28,4);
          auVar245._13_3_ = 0;
          auVar245._0_13_ = SUB1613(auVar246 << 0x20,3);
          auVar369._14_2_ = 0;
          auVar369._0_14_ = SUB1614(auVar245 << 0x18,2);
          auVar369 = auVar369 << 0x10;
          uVar279 = CONCAT12(bVar105,CONCAT11(bVar99,uVar96));
          uVar314 = CONCAT13(bVar111,uVar279);
          uVar316 = CONCAT14(bVar117,uVar314);
          auVar332[5] = bVar13;
          auVar332._0_5_ = uVar316;
          auVar430._0_14_ = auVar518._0_14_;
          auVar430[0xe] = puVar6[4];
          auVar430[0xf] = bVar136;
          auVar429._14_2_ = auVar430._14_2_;
          auVar429._0_13_ = auVar518._0_13_;
          auVar429[0xd] = bVar129;
          auVar428._13_3_ = auVar429._13_3_;
          auVar428._0_12_ = auVar518._0_12_;
          auVar428[0xc] = bVar124;
          auVar427._12_4_ = auVar428._12_4_;
          auVar427._0_11_ = auVar518._0_11_;
          auVar427[0xb] = bVar119;
          auVar426._11_5_ = auVar427._11_5_;
          auVar426._0_10_ = auVar518._0_10_;
          auVar426[10] = bVar113;
          auVar425._10_6_ = auVar426._10_6_;
          auVar425._0_9_ = auVar518._0_9_;
          auVar425[9] = bVar107;
          auVar424._9_7_ = auVar425._9_7_;
          auVar424._0_8_ = auVar518._0_8_;
          auVar424[8] = bVar101;
          auVar254._1_8_ = auVar424._8_8_;
          auVar254[0] = puVar4[0xc];
          auVar254._9_7_ = 0;
          auVar253._10_6_ = 0;
          auVar253._0_10_ = SUB1610(auVar254 << 0x38,6);
          auVar252._11_5_ = 0;
          auVar252._0_11_ = SUB1611(auVar253 << 0x30,5);
          auVar251._12_4_ = 0;
          auVar251._0_12_ = SUB1612(auVar252 << 0x28,4);
          auVar250._13_3_ = 0;
          auVar250._0_13_ = SUB1613(auVar251 << 0x20,3);
          auVar423._14_2_ = 0;
          auVar423._0_14_ = SUB1614(auVar250 << 0x18,2);
          auVar423 = auVar423 << 0x10;
          uVar280 = CONCAT12(bVar108,CONCAT11(bVar102,uVar97));
          uVar315 = CONCAT13(bVar114,uVar280);
          uVar317 = CONCAT14(bVar120,uVar315);
          auVar333[5] = bVar125;
          auVar333._0_5_ = uVar317;
          auVar32[0xd] = 0;
          auVar32._0_13_ = auVar369._0_13_;
          auVar32[0xe] = puVar4[8];
          uVar393 = auVar32._13_2_;
          auVar43[0xc] = *puVar4;
          auVar43._0_12_ = auVar369._0_12_;
          auVar43._13_2_ = uVar393;
          auVar56[0xb] = 0;
          auVar56._0_11_ = auVar369._0_11_;
          auVar56._12_3_ = auVar43._12_3_;
          auVar67[10] = puVar3[8];
          auVar67._0_10_ = auVar369._0_10_;
          auVar67._11_4_ = auVar56._11_4_;
          auVar80[9] = 0;
          auVar80._0_9_ = auVar369._0_9_;
          auVar80._10_5_ = auVar67._10_5_;
          auVar91[8] = *puVar3;
          auVar91._0_8_ = auVar369._0_8_;
          auVar91._9_6_ = auVar80._9_6_;
          auVar255._7_8_ = 0;
          auVar255._0_7_ = auVar91._8_7_;
          Var184 = CONCAT81(SUB158(auVar255 << 0x40,7),puVar2[8]);
          auVar298._9_6_ = 0;
          auVar298._0_9_ = Var184;
          auVar256._1_10_ = SUB1510(auVar298 << 0x30,5);
          auVar256[0] = *puVar2;
          auVar299._11_4_ = 0;
          auVar299._0_11_ = auVar256;
          auVar257._1_12_ = SUB1512(auVar299 << 0x20,3);
          auVar257[0] = auVar441[8];
          auVar332._6_8_ = 0;
          auVar33[0xe] = uVar96;
          auVar33._0_14_ = auVar332 << 0x38;
          uVar328 = CONCAT26(auVar33._13_2_,CONCAT15(puVar4[1],uVar316));
          auVar323._4_8_ = 0;
          auVar323._0_4_ = uVar314;
          auVar57._12_3_ = (int3)((ulong)uVar328 >> 0x28);
          auVar57._0_12_ = auVar323 << 0x38;
          uVar319 = CONCAT44(auVar57._11_4_,CONCAT13(puVar3[9],uVar279));
          auVar81._10_5_ = (int5)((ulong)uVar319 >> 0x18);
          auVar81._0_10_ = (unkuint10)CONCAT11(bVar99,uVar96) << 0x38;
          uVar283 = CONCAT62(auVar81._9_6_,CONCAT11(puVar3[1],uVar96));
          auVar258._7_8_ = 0;
          auVar258._0_7_ = (uint7)((ulong)uVar283 >> 8);
          Var188 = CONCAT81(SUB158(auVar258 << 0x40,7),puVar2[9]);
          auVar300._9_6_ = 0;
          auVar300._0_9_ = Var188;
          auVar259._1_10_ = SUB1510(auVar300 << 0x30,5);
          auVar259[0] = puVar2[1];
          auVar301._11_4_ = 0;
          auVar301._0_11_ = auVar259;
          auVar260._1_12_ = SUB1512(auVar301 << 0x20,3);
          auVar260[0] = auVar441[9];
          auVar34[0xd] = 0;
          auVar34._0_13_ = auVar439._0_13_;
          auVar34[0xe] = puVar4[10];
          uVar397 = auVar34._13_2_;
          auVar44[0xc] = puVar4[2];
          auVar44._0_12_ = auVar439._0_12_;
          auVar44._13_2_ = uVar397;
          auVar58[0xb] = 0;
          auVar58._0_11_ = auVar439._0_11_;
          auVar58._12_3_ = auVar44._12_3_;
          auVar68[10] = puVar3[10];
          auVar68._0_10_ = auVar439._0_10_;
          auVar68._11_4_ = auVar58._11_4_;
          auVar82[9] = 0;
          auVar82._0_9_ = auVar439._0_9_;
          auVar82._10_5_ = auVar68._10_5_;
          auVar92[8] = puVar3[2];
          auVar92._0_8_ = auVar439._0_8_;
          auVar92._9_6_ = auVar82._9_6_;
          auVar261._7_8_ = 0;
          auVar261._0_7_ = auVar92._8_7_;
          Var192 = CONCAT81(SUB158(auVar261 << 0x40,7),puVar2[10]);
          auVar302._9_6_ = 0;
          auVar302._0_9_ = Var192;
          auVar262._1_10_ = SUB1510(auVar302 << 0x30,5);
          auVar262[0] = puVar2[2];
          auVar303._11_4_ = 0;
          auVar303._0_11_ = auVar262;
          auVar263._1_12_ = SUB1512(auVar303 << 0x20,3);
          auVar263[0] = auVar441[10];
          sVar395 = (short)Var184;
          sVar416 = (short)Var192;
          uVar368 = (ushort)(local_e8 * (ushort)bVar462 +
                            (ushort)auVar441[1] * local_d8 + local_a8 * (ushort)auVar441[0]) >> 8;
          uVar378 = (ushort)(sStack_e6 * auVar263._0_2_ +
                            auVar260._0_2_ * sStack_d6 + sStack_a6 * auVar257._0_2_) >> 8;
          uVar380 = (ushort)(local_e8 * auVar262._0_2_ +
                            auVar259._0_2_ * local_d8 + local_a8 * auVar256._0_2_) >> 8;
          uVar382 = (ushort)(sStack_e6 * sVar416 + (short)Var188 * sStack_d6 + sStack_a6 * sVar395)
                    >> 8;
          uVar385 = (ushort)(local_e8 * auVar92._8_2_ +
                            (short)((ulong)uVar283 >> 8) * local_d8 + local_a8 * auVar91._8_2_) >> 8
          ;
          uVar389 = (ushort)(sStack_e6 * auVar68._10_2_ +
                            (short)((ulong)uVar319 >> 0x18) * sStack_d6 + sStack_a6 * auVar67._10_2_
                            ) >> 8;
          uVar394 = (ushort)(local_e8 * auVar44._12_2_ +
                            (short)((ulong)uVar328 >> 0x28) * local_d8 + local_a8 * auVar43._12_2_)
                    >> 8;
          uVar398 = (ushort)(sStack_e6 * (uVar397 >> 8) +
                            (auVar33._13_2_ >> 8) * sStack_d6 + sStack_a6 * (uVar393 >> 8)) >> 8;
          auVar35[0xd] = 0;
          auVar35._0_13_ = auVar423._0_13_;
          auVar35[0xe] = puVar4[0xc];
          auVar45[0xc] = puVar4[4];
          auVar45._0_12_ = auVar423._0_12_;
          auVar45._13_2_ = auVar35._13_2_;
          auVar59[0xb] = 0;
          auVar59._0_11_ = auVar423._0_11_;
          auVar59._12_3_ = auVar45._12_3_;
          auVar69[10] = puVar3[0xc];
          auVar69._0_10_ = auVar423._0_10_;
          auVar69._11_4_ = auVar59._11_4_;
          auVar83[9] = 0;
          auVar83._0_9_ = auVar423._0_9_;
          auVar83._10_5_ = auVar69._10_5_;
          auVar93[8] = puVar3[4];
          auVar93._0_8_ = auVar423._0_8_;
          auVar93._9_6_ = auVar83._9_6_;
          auVar264._7_8_ = 0;
          auVar264._0_7_ = auVar93._8_7_;
          Var184 = CONCAT81(SUB158(auVar264 << 0x40,7),puVar2[0xc]);
          auVar304._9_6_ = 0;
          auVar304._0_9_ = Var184;
          auVar265._1_10_ = SUB1510(auVar304 << 0x30,5);
          auVar265[0] = puVar2[4];
          auVar305._11_4_ = 0;
          auVar305._0_11_ = auVar265;
          auVar266._1_12_ = SUB1512(auVar305 << 0x20,3);
          auVar266[0] = auVar441[0xc];
          auVar333._6_8_ = 0;
          auVar36[0xe] = uVar97;
          auVar36._0_14_ = auVar333 << 0x38;
          uVar328 = CONCAT26(auVar36._13_2_,CONCAT15(puVar4[5],uVar317));
          auVar324._4_8_ = 0;
          auVar324._0_4_ = uVar315;
          auVar60._12_3_ = (int3)((ulong)uVar328 >> 0x28);
          auVar60._0_12_ = auVar324 << 0x38;
          uVar319 = CONCAT44(auVar60._11_4_,CONCAT13(puVar3[0xd],uVar280));
          auVar84._10_5_ = (int5)((ulong)uVar319 >> 0x18);
          auVar84._0_10_ = (unkuint10)CONCAT11(bVar102,uVar97) << 0x38;
          uVar283 = CONCAT62(auVar84._9_6_,CONCAT11(puVar3[5],uVar97));
          auVar267._7_8_ = 0;
          auVar267._0_7_ = (uint7)((ulong)uVar283 >> 8);
          Var188 = CONCAT81(SUB158(auVar267 << 0x40,7),puVar2[0xd]);
          auVar306._9_6_ = 0;
          auVar306._0_9_ = Var188;
          auVar268._1_10_ = SUB1510(auVar306 << 0x30,5);
          auVar268[0] = puVar2[5];
          auVar307._11_4_ = 0;
          auVar307._0_11_ = auVar268;
          auVar269._1_12_ = SUB1512(auVar307 << 0x20,3);
          auVar269[0] = auVar441[0xd];
          auVar37[0xd] = 0;
          auVar37._0_13_ = auVar460._0_13_;
          auVar37[0xe] = puVar4[0xe];
          auVar46[0xc] = puVar4[6];
          auVar46._0_12_ = auVar460._0_12_;
          auVar46._13_2_ = auVar37._13_2_;
          auVar61[0xb] = 0;
          auVar61._0_11_ = auVar460._0_11_;
          auVar61._12_3_ = auVar46._12_3_;
          auVar70[10] = puVar3[0xe];
          auVar70._0_10_ = auVar460._0_10_;
          auVar70._11_4_ = auVar61._11_4_;
          auVar85[9] = 0;
          auVar85._0_9_ = auVar460._0_9_;
          auVar85._10_5_ = auVar70._10_5_;
          auVar94[8] = puVar3[6];
          auVar94._0_8_ = auVar460._0_8_;
          auVar94._9_6_ = auVar85._9_6_;
          auVar270._7_8_ = 0;
          auVar270._0_7_ = auVar94._8_7_;
          Var192 = CONCAT81(SUB158(auVar270 << 0x40,7),puVar2[0xe]);
          auVar308._9_6_ = 0;
          auVar308._0_9_ = Var192;
          auVar271._1_10_ = SUB1510(auVar308 << 0x30,5);
          auVar271[0] = puVar2[6];
          auVar309._11_4_ = 0;
          auVar309._0_11_ = auVar271;
          auVar272._1_12_ = SUB1512(auVar309 << 0x20,3);
          auVar272[0] = auVar441[0xe];
          sVar477 = (short)Var184;
          uVar401 = auVar35._13_2_ >> 8;
          sVar478 = (short)Var192;
          uVar418 = auVar37._13_2_ >> 8;
          uVar344 = (ushort)(local_e8 * (ushort)bVar465 +
                            (ushort)bVar464 * local_d8 + local_a8 * (ushort)bVar463) >> 8;
          uVar361 = (ushort)(sStack_e6 * auVar272._0_2_ +
                            auVar269._0_2_ * sStack_d6 + sStack_a6 * auVar266._0_2_) >> 8;
          uVar362 = (ushort)(local_e8 * auVar271._0_2_ +
                            auVar268._0_2_ * local_d8 + local_a8 * auVar265._0_2_) >> 8;
          uVar363 = (ushort)(sStack_e6 * sVar478 + (short)Var188 * sStack_d6 + sStack_a6 * sVar477)
                    >> 8;
          uVar364 = (ushort)(local_e8 * auVar94._8_2_ +
                            (short)((ulong)uVar283 >> 8) * local_d8 + local_a8 * auVar93._8_2_) >> 8
          ;
          uVar365 = (ushort)(sStack_e6 * auVar70._10_2_ +
                            (short)((ulong)uVar319 >> 0x18) * sStack_d6 + sStack_a6 * auVar69._10_2_
                            ) >> 8;
          uVar366 = (ushort)(local_e8 * auVar46._12_2_ +
                            (short)((ulong)uVar328 >> 0x28) * local_d8 + local_a8 * auVar45._12_2_)
                    >> 8;
          uVar367 = (ushort)(sStack_e6 * uVar418 +
                            (auVar36._13_2_ >> 8) * sStack_d6 + sStack_a6 * uVar401) >> 8;
          sVar345 = ((ushort)(uVar368 * local_b8) >> 7) + local_f8;
          sVar386 = ((ushort)(uVar378 * sStack_b6) >> 7) + sStack_f6;
          sVar390 = ((ushort)(uVar380 * local_b8) >> 7) + local_f8;
          sVar399 = ((ushort)(uVar382 * sStack_b6) >> 7) + sStack_f6;
          sVar403 = ((ushort)(uVar385 * local_b8) >> 7) + local_f8;
          sVar406 = ((ushort)(uVar389 * sStack_b6) >> 7) + sStack_f6;
          sVar409 = ((ushort)(uVar394 * local_b8) >> 7) + local_f8;
          sVar412 = ((ushort)(uVar398 * sStack_b6) >> 7) + sStack_f6;
          sVar392 = ((ushort)(uVar344 * local_b8) >> 7) + local_f8;
          sVar414 = ((ushort)(uVar361 * sStack_b6) >> 7) + sStack_f6;
          sVar415 = ((ushort)(uVar362 * local_b8) >> 7) + local_f8;
          sVar417 = ((ushort)(uVar363 * sStack_b6) >> 7) + sStack_f6;
          sVar419 = ((ushort)(uVar364 * local_b8) >> 7) + local_f8;
          sVar420 = ((ushort)(uVar365 * sStack_b6) >> 7) + sStack_f6;
          sVar421 = ((ushort)(uVar366 * local_b8) >> 7) + local_f8;
          sVar422 = ((ushort)(uVar367 * sStack_b6) >> 7) + sStack_f6;
          bVar13 = (0 < sVar345) * (sVar345 < 0x100) * (char)sVar345 - (0xff < sVar345);
          cVar8 = (0 < sVar386) * (sVar386 < 0x100) * (char)sVar386 - (0xff < sVar386);
          cVar7 = (0 < sVar390) * (sVar390 < 0x100) * (char)sVar390 - (0xff < sVar390);
          cVar12 = (0 < sVar399) * (sVar399 < 0x100) * (char)sVar399 - (0xff < sVar399);
          cVar11 = (0 < sVar403) * (sVar403 < 0x100) * (char)sVar403 - (0xff < sVar403);
          cVar10 = (0 < sVar406) * (sVar406 < 0x100) * (char)sVar406 - (0xff < sVar406);
          cVar9 = (0 < sVar409) * (sVar409 < 0x100) * (char)sVar409 - (0xff < sVar409);
          bVar17 = (0 < sVar412) * (sVar412 < 0x100) * (char)sVar412 - (0xff < sVar412);
          bVar14 = (0 < sVar392) * (sVar392 < 0x100) * (char)sVar392 - (0xff < sVar392);
          bVar15 = (0 < sVar414) * (sVar414 < 0x100) * (char)sVar414 - (0xff < sVar414);
          uVar279 = CONCAT12(bVar15,CONCAT11(bVar14,bVar17));
          bVar16 = (0 < sVar415) * (sVar415 < 0x100) * (char)sVar415 - (0xff < sVar415);
          uVar314 = CONCAT13(bVar16,uVar279);
          bVar18 = (0 < sVar417) * (sVar417 < 0x100) * (char)sVar417 - (0xff < sVar417);
          uVar316 = CONCAT14(bVar18,uVar314);
          bVar19 = (0 < sVar419) * (sVar419 < 0x100) * (char)sVar419 - (0xff < sVar419);
          auVar334[5] = bVar19;
          auVar334._0_5_ = uVar316;
          bVar20 = (0 < sVar420) * (sVar420 < 0x100) * (char)sVar420 - (0xff < sVar420);
          bVar21 = (0 < sVar421) * (sVar421 < 0x100) * (char)sVar421 - (0xff < sVar421);
          bVar464 = (0 < sVar422) * (sVar422 < 0x100) * (char)sVar422 - (0xff < sVar422);
          auVar334._6_8_ = 0;
          auVar38[0xe] = bVar17;
          auVar38._0_14_ = auVar334 << 0x38;
          uVar328 = CONCAT26(auVar38._13_2_,CONCAT15(cVar9,uVar316));
          auVar325._4_8_ = 0;
          auVar325._0_4_ = uVar314;
          auVar62._12_3_ = (int3)((ulong)uVar328 >> 0x28);
          auVar62._0_12_ = auVar325 << 0x38;
          uVar319 = CONCAT44(auVar62._11_4_,CONCAT13(cVar10,uVar279));
          auVar86._10_5_ = (int5)((ulong)uVar319 >> 0x18);
          auVar86._0_10_ = (unkuint10)CONCAT11(bVar14,bVar17) << 0x38;
          uVar283 = CONCAT62(auVar86._9_6_,CONCAT11(cVar11,bVar17));
          auVar273._7_8_ = 0;
          auVar273._0_7_ = (uint7)((ulong)uVar283 >> 8);
          Var184 = CONCAT81(SUB158(auVar273 << 0x40,7),cVar12);
          auVar310._9_6_ = 0;
          auVar310._0_9_ = Var184;
          auVar274._1_10_ = SUB1510(auVar310 << 0x30,5);
          auVar274[0] = cVar7;
          auVar311._11_4_ = 0;
          auVar311._0_11_ = auVar274;
          auVar275._1_12_ = SUB1512(auVar311 << 0x20,3);
          auVar275[0] = cVar8;
          sVar345 = (short)((ulong)uVar283 >> 8);
          sVar386 = (short)((ulong)uVar319 >> 0x18);
          sVar390 = (short)((ulong)uVar328 >> 0x28);
          uVar381 = (ushort)Var184;
          uVar379 = auVar274._0_2_;
          uVar377 = auVar275._0_2_;
          puVar2 = Y + lVar337 * 2 + uVar342 + 0x10;
          *puVar2 = (bVar13 != 0) * (bVar13 < 0x100) * bVar13 - (0xff < bVar13);
          puVar2[1] = (bVar14 != 0) * (bVar14 < 0x100) * bVar14 - (0xff < bVar14);
          puVar2[2] = (uVar377 != 0) * (uVar377 < 0x100) * cVar8 - (0xff < uVar377);
          puVar2[3] = (bVar15 != 0) * (bVar15 < 0x100) * bVar15 - (0xff < bVar15);
          puVar2[4] = (uVar379 != 0) * (uVar379 < 0x100) * cVar7 - (0xff < uVar379);
          puVar2[5] = (bVar16 != 0) * (bVar16 < 0x100) * bVar16 - (0xff < bVar16);
          puVar2[6] = (uVar381 != 0) * (uVar381 < 0x100) * cVar12 - (0xff < uVar381);
          puVar2[7] = (bVar18 != 0) * (bVar18 < 0x100) * bVar18 - (0xff < bVar18);
          puVar2[8] = (0 < sVar345) * (sVar345 < 0x100) * cVar11 - (0xff < sVar345);
          puVar2[9] = (bVar19 != 0) * (bVar19 < 0x100) * bVar19 - (0xff < bVar19);
          puVar2[10] = (0 < sVar386) * (sVar386 < 0x100) * cVar10 - (0xff < sVar386);
          puVar2[0xb] = (bVar20 != 0) * (bVar20 < 0x100) * bVar20 - (0xff < bVar20);
          puVar2[0xc] = (0 < sVar390) * (sVar390 < 0x100) * cVar9 - (0xff < sVar390);
          puVar2[0xd] = (bVar21 != 0) * (bVar21 < 0x100) * bVar21 - (0xff < bVar21);
          puVar2[0xe] = (bVar17 != 0) * (bVar17 < 0x100) * bVar17 - (0xff < bVar17);
          puVar2[0xf] = (bVar464 != 0) * (bVar464 < 0x100) * bVar464 - (0xff < bVar464);
          uVar377 = (ushort)(local_e8 * (ushort)bVar100 +
                            (ushort)bVar99 * local_d8 + local_a8 * (ushort)bVar98) >> 8;
          uVar379 = (ushort)(sStack_e6 * (ushort)bVar106 +
                            (ushort)bVar105 * sStack_d6 + sStack_a6 * (ushort)bVar104) >> 8;
          uVar381 = (ushort)(local_e8 * (ushort)bVar112 +
                            (ushort)bVar111 * local_d8 + local_a8 * (ushort)bVar110) >> 8;
          uVar383 = (ushort)(sStack_e6 * (ushort)bVar118 +
                            (ushort)bVar117 * sStack_d6 + sStack_a6 * (ushort)bVar116) >> 8;
          uVar387 = (ushort)(local_e8 * (ushort)bVar123 +
                            (auVar490._14_2_ & 0xff) * local_d8 + local_a8 * (ushort)bVar122) >> 8;
          uVar391 = (ushort)(sStack_e6 * (ushort)bVar128 +
                            (auVar384._14_2_ & 0xff) * sStack_d6 + sStack_a6 * (ushort)bVar127) >> 8
          ;
          uVar396 = (ushort)(local_e8 * (ushort)bVar132 +
                            (auVar490._14_2_ >> 8) * local_d8 + local_a8 * (auVar375._14_2_ & 0xff))
                    >> 8;
          uVar400 = (ushort)(sStack_e6 * (ushort)bVar135 +
                            (auVar384._14_2_ >> 8) * sStack_d6 + sStack_a6 * (auVar375._14_2_ >> 8))
                    >> 8;
          uVar402 = (ushort)(local_e8 * (ushort)bVar103 +
                            (ushort)bVar102 * local_d8 + local_a8 * (ushort)bVar101) >> 8;
          uVar404 = (ushort)(sStack_e6 * (ushort)bVar109 +
                            (ushort)bVar108 * sStack_d6 + sStack_a6 * (ushort)bVar107) >> 8;
          uVar405 = (ushort)(local_e8 * (ushort)bVar115 +
                            (ushort)bVar114 * local_d8 + local_a8 * (ushort)bVar113) >> 8;
          uVar407 = (ushort)(sStack_e6 * (ushort)bVar121 +
                            (ushort)bVar120 * sStack_d6 + sStack_a6 * (ushort)bVar119) >> 8;
          uVar408 = (ushort)(local_e8 * (ushort)bVar126 +
                            (ushort)bVar125 * local_d8 + local_a8 * (ushort)bVar124) >> 8;
          uVar410 = (ushort)(sStack_e6 * (ushort)bVar131 +
                            (ushort)bVar130 * sStack_d6 + sStack_a6 * (ushort)bVar129) >> 8;
          uVar411 = (ushort)(local_e8 * (ushort)bVar134 +
                            (ushort)bVar133 * local_d8 + local_a8 * (auVar429._14_2_ & 0xff)) >> 8;
          uVar413 = (ushort)(sStack_e6 * (ushort)bVar461 +
                            (ushort)bVar137 * sStack_d6 + sStack_a6 * (ushort)bVar136) >> 8;
          sVar345 = uVar344 + uVar368 + uVar402 + uVar377;
          sVar386 = uVar361 + uVar378 + uVar404 + uVar379;
          sVar390 = uVar362 + uVar380 + uVar405 + uVar381;
          sVar399 = uVar363 + uVar382 + uVar407 + uVar383;
          sVar403 = uVar364 + uVar385 + uVar408 + uVar387;
          sVar406 = uVar365 + uVar389 + uVar410 + uVar391;
          sVar409 = uVar366 + uVar394 + uVar411 + uVar396;
          sVar412 = uVar367 + uVar398 + uVar413 + uVar400;
          auVar501._0_2_ =
               ((ushort)bVar465 + (ushort)bVar462 + (ushort)bVar103 + (ushort)bVar100) - sVar345;
          auVar501._2_2_ =
               (auVar272._0_2_ + auVar263._0_2_ + (ushort)bVar109 + (ushort)bVar106) - sVar386;
          auVar501._4_2_ =
               (auVar271._0_2_ + auVar262._0_2_ + (ushort)bVar115 + (ushort)bVar112) - sVar390;
          auVar501._6_2_ = (sVar478 + sVar416 + (ushort)bVar121 + (ushort)bVar118) - sVar399;
          auVar501._8_2_ =
               (auVar94._8_2_ + auVar92._8_2_ + (ushort)bVar126 + (ushort)bVar123) - sVar403;
          auVar501._10_2_ =
               (auVar70._10_2_ + auVar68._10_2_ + (ushort)bVar131 + (ushort)bVar128) - sVar406;
          auVar501._12_2_ =
               (auVar46._12_2_ + auVar44._12_2_ + (ushort)bVar134 + (ushort)bVar132) - sVar409;
          auVar501._14_2_ = (uVar418 + (uVar397 >> 8) + (ushort)bVar461 + (ushort)bVar135) - sVar412
          ;
          auVar475._0_2_ =
               ((ushort)bVar463 + (ushort)auVar441[0] + (ushort)bVar101 + (ushort)bVar98) - sVar345;
          auVar475._2_2_ =
               (auVar266._0_2_ + auVar257._0_2_ + (ushort)bVar107 + (ushort)bVar104) - sVar386;
          auVar475._4_2_ =
               (auVar265._0_2_ + auVar256._0_2_ + (ushort)bVar113 + (ushort)bVar110) - sVar390;
          auVar475._6_2_ = (sVar477 + sVar395 + (ushort)bVar119 + (ushort)bVar116) - sVar399;
          auVar475._8_2_ =
               (auVar93._8_2_ + auVar91._8_2_ + (ushort)bVar124 + (ushort)bVar122) - sVar403;
          auVar475._10_2_ =
               (auVar69._10_2_ + auVar67._10_2_ + (ushort)bVar129 + (ushort)bVar127) - sVar406;
          auVar475._12_2_ =
               (auVar45._12_2_ + auVar43._12_2_ +
               (auVar429._14_2_ & 0xff) + (auVar375._14_2_ & 0xff)) - sVar409;
          auVar475._14_2_ =
               (uVar401 + (uVar393 >> 8) + (ushort)bVar136 + (auVar375._14_2_ >> 8)) - sVar412;
          sVar345 = ((ushort)(uVar377 * local_b8) >> 7) + local_f8;
          sVar386 = ((ushort)(uVar379 * sStack_b6) >> 7) + sStack_f6;
          sVar390 = ((ushort)(uVar381 * local_b8) >> 7) + local_f8;
          sVar395 = ((ushort)(uVar383 * sStack_b6) >> 7) + sStack_f6;
          sVar399 = ((ushort)(uVar387 * local_b8) >> 7) + local_f8;
          sVar403 = ((ushort)(uVar391 * sStack_b6) >> 7) + sStack_f6;
          sVar406 = ((ushort)(uVar396 * local_b8) >> 7) + local_f8;
          sVar409 = ((ushort)(uVar400 * sStack_b6) >> 7) + sStack_f6;
          sVar412 = ((ushort)(uVar402 * local_b8) >> 7) + local_f8;
          sVar392 = ((ushort)(uVar404 * sStack_b6) >> 7) + sStack_f6;
          sVar414 = ((ushort)(uVar405 * local_b8) >> 7) + local_f8;
          sVar415 = ((ushort)(uVar407 * sStack_b6) >> 7) + sStack_f6;
          sVar416 = ((ushort)(uVar408 * local_b8) >> 7) + local_f8;
          sVar417 = ((ushort)(uVar410 * sStack_b6) >> 7) + sStack_f6;
          local_f8 = ((ushort)(uVar411 * local_b8) >> 7) + local_f8;
          sStack_f6 = ((ushort)(uVar413 * sStack_b6) >> 7) + sStack_f6;
          bVar14 = (0 < sVar345) * (sVar345 < 0x100) * (char)sVar345 - (0xff < sVar345);
          cVar8 = (0 < sVar386) * (sVar386 < 0x100) * (char)sVar386 - (0xff < sVar386);
          cVar9 = (0 < sVar390) * (sVar390 < 0x100) * (char)sVar390 - (0xff < sVar390);
          cVar10 = (0 < sVar395) * (sVar395 < 0x100) * (char)sVar395 - (0xff < sVar395);
          cVar11 = (0 < sVar399) * (sVar399 < 0x100) * (char)sVar399 - (0xff < sVar399);
          cVar12 = (0 < sVar403) * (sVar403 < 0x100) * (char)sVar403 - (0xff < sVar403);
          cVar7 = (0 < sVar406) * (sVar406 < 0x100) * (char)sVar406 - (0xff < sVar406);
          bVar15 = (0 < sVar409) * (sVar409 < 0x100) * (char)sVar409 - (0xff < sVar409);
          bVar16 = (0 < sVar412) * (sVar412 < 0x100) * (char)sVar412 - (0xff < sVar412);
          bVar18 = (0 < sVar392) * (sVar392 < 0x100) * (char)sVar392 - (0xff < sVar392);
          uVar279 = CONCAT12(bVar18,CONCAT11(bVar16,bVar15));
          bVar17 = (0 < sVar414) * (sVar414 < 0x100) * (char)sVar414 - (0xff < sVar414);
          uVar314 = CONCAT13(bVar17,uVar279);
          bVar19 = (0 < sVar415) * (sVar415 < 0x100) * (char)sVar415 - (0xff < sVar415);
          uVar316 = CONCAT14(bVar19,uVar314);
          bVar20 = (0 < sVar416) * (sVar416 < 0x100) * (char)sVar416 - (0xff < sVar416);
          auVar335[5] = bVar20;
          auVar335._0_5_ = uVar316;
          bVar21 = (0 < sVar417) * (sVar417 < 0x100) * (char)sVar417 - (0xff < sVar417);
          bVar464 = (0 < local_f8) * (local_f8 < 0x100) * (char)local_f8 - (0xff < local_f8);
          bVar13 = (0 < sStack_f6) * (sStack_f6 < 0x100) * (char)sStack_f6 - (0xff < sStack_f6);
          auVar335._6_8_ = 0;
          auVar24[0xe] = bVar15;
          auVar24._0_14_ = auVar335 << 0x38;
          uVar328 = CONCAT26(auVar24._13_2_,CONCAT15(cVar7,uVar316));
          auVar326._4_8_ = 0;
          auVar326._0_4_ = uVar314;
          auVar47._12_3_ = (int3)((ulong)uVar328 >> 0x28);
          auVar47._0_12_ = auVar326 << 0x38;
          uVar319 = CONCAT44(auVar47._11_4_,CONCAT13(cVar12,uVar279));
          auVar71._10_5_ = (int5)((ulong)uVar319 >> 0x18);
          auVar71._0_10_ = (unkuint10)CONCAT11(bVar16,bVar15) << 0x38;
          uVar283 = CONCAT62(auVar71._9_6_,CONCAT11(cVar11,bVar15));
          auVar276._7_8_ = 0;
          auVar276._0_7_ = (uint7)((ulong)uVar283 >> 8);
          Var184 = CONCAT81(SUB158(auVar276 << 0x40,7),cVar10);
          auVar312._9_6_ = 0;
          auVar312._0_9_ = Var184;
          auVar277._1_10_ = SUB1510(auVar312 << 0x30,5);
          auVar277[0] = cVar9;
          auVar313._11_4_ = 0;
          auVar313._0_11_ = auVar277;
          auVar278._1_12_ = SUB1512(auVar313 << 0x20,3);
          auVar278[0] = cVar8;
          uVar393 = (ushort)bVar14;
          sVar345 = (short)((ulong)uVar283 >> 8);
          sVar386 = (short)((ulong)uVar319 >> 0x18);
          sVar390 = (short)((ulong)uVar328 >> 0x28);
          uVar418 = (ushort)Var184;
          uVar401 = auVar277._0_2_;
          uVar397 = auVar278._0_2_;
          puVar2 = Y + lVar337 * 2 + (ulong)Y_stride + 0x10;
          *puVar2 = (uVar393 != 0) * (uVar393 < 0x100) * bVar14 - (0xff < uVar393);
          puVar2[1] = (bVar16 != 0) * (bVar16 < 0x100) * bVar16 - (0xff < bVar16);
          puVar2[2] = (uVar397 != 0) * (uVar397 < 0x100) * cVar8 - (0xff < uVar397);
          puVar2[3] = (bVar18 != 0) * (bVar18 < 0x100) * bVar18 - (0xff < bVar18);
          puVar2[4] = (uVar401 != 0) * (uVar401 < 0x100) * cVar9 - (0xff < uVar401);
          puVar2[5] = (bVar17 != 0) * (bVar17 < 0x100) * bVar17 - (0xff < bVar17);
          puVar2[6] = (uVar418 != 0) * (uVar418 < 0x100) * cVar10 - (0xff < uVar418);
          puVar2[7] = (bVar19 != 0) * (bVar19 < 0x100) * bVar19 - (0xff < bVar19);
          puVar2[8] = (0 < sVar345) * (sVar345 < 0x100) * cVar11 - (0xff < sVar345);
          puVar2[9] = (bVar20 != 0) * (bVar20 < 0x100) * bVar20 - (0xff < bVar20);
          puVar2[10] = (0 < sVar386) * (sVar386 < 0x100) * cVar12 - (0xff < sVar386);
          puVar2[0xb] = (bVar21 != 0) * (bVar21 < 0x100) * bVar21 - (0xff < bVar21);
          puVar2[0xc] = (0 < sVar390) * (sVar390 < 0x100) * cVar7 - (0xff < sVar390);
          puVar2[0xd] = (bVar464 != 0) * (bVar464 < 0x100) * bVar464 - (0xff < bVar464);
          puVar2[0xe] = (bVar15 != 0) * (bVar15 < 0x100) * bVar15 - (0xff < bVar15);
          puVar2[0xf] = (bVar13 != 0) * (bVar13 < 0x100) * bVar13 - (0xff < bVar13);
          auVar441 = psraw(auVar440,2);
          local_68 = auVar351._0_2_;
          sStack_66 = auVar351._2_2_;
          auVar442._0_2_ = auVar441._0_2_ * local_68;
          auVar442._2_2_ = auVar441._2_2_ * sStack_66;
          auVar442._4_2_ = auVar441._4_2_ * local_68;
          auVar442._6_2_ = auVar441._6_2_ * sStack_66;
          auVar442._8_2_ = auVar441._8_2_ * local_68;
          auVar442._10_2_ = auVar441._10_2_ * sStack_66;
          auVar442._12_2_ = auVar441._12_2_ * local_68;
          auVar442._14_2_ = auVar441._14_2_ * sStack_66;
          auVar441 = psraw(auVar442,8);
          sVar412 = auVar441._0_2_ + 0x80;
          sVar392 = auVar441._2_2_ + 0x80;
          sVar414 = auVar441._4_2_ + 0x80;
          sVar415 = auVar441._6_2_ + 0x80;
          sVar416 = auVar441._8_2_ + 0x80;
          sVar417 = auVar441._10_2_ + 0x80;
          sVar419 = auVar441._12_2_ + 0x80;
          sVar420 = auVar441._14_2_ + 0x80;
          auVar441 = psraw(auVar501,2);
          auVar502._0_2_ = auVar441._0_2_ * local_68;
          auVar502._2_2_ = auVar441._2_2_ * sStack_66;
          auVar502._4_2_ = auVar441._4_2_ * local_68;
          auVar502._6_2_ = auVar441._6_2_ * sStack_66;
          auVar502._8_2_ = auVar441._8_2_ * local_68;
          auVar502._10_2_ = auVar441._10_2_ * sStack_66;
          auVar502._12_2_ = auVar441._12_2_ * local_68;
          auVar502._14_2_ = auVar441._14_2_ * sStack_66;
          auVar441 = psraw(auVar502,8);
          sVar492 = auVar441._0_2_ + 0x80;
          sVar503 = auVar441._2_2_ + 0x80;
          sVar504 = auVar441._4_2_ + 0x80;
          sVar505 = auVar441._6_2_ + 0x80;
          sVar506 = auVar441._8_2_ + 0x80;
          sVar507 = auVar441._10_2_ + 0x80;
          sVar508 = auVar441._12_2_ + 0x80;
          sVar509 = auVar441._14_2_ + 0x80;
          auVar441 = psraw(local_c8,2);
          local_78 = auVar352._0_2_;
          sStack_76 = auVar352._2_2_;
          auVar343._0_2_ = auVar441._0_2_ * local_78;
          auVar343._2_2_ = auVar441._2_2_ * sStack_76;
          auVar343._4_2_ = auVar441._4_2_ * local_78;
          auVar343._6_2_ = auVar441._6_2_ * sStack_76;
          auVar343._8_2_ = auVar441._8_2_ * local_78;
          auVar343._10_2_ = auVar441._10_2_ * sStack_76;
          auVar343._12_2_ = auVar441._12_2_ * local_78;
          auVar343._14_2_ = auVar441._14_2_ * sStack_76;
          auVar441 = psraw(auVar343,8);
          sVar345 = auVar441._0_2_ + 0x80;
          sVar386 = auVar441._2_2_ + 0x80;
          sVar390 = auVar441._4_2_ + 0x80;
          sVar395 = auVar441._6_2_ + 0x80;
          sVar399 = auVar441._8_2_ + 0x80;
          sVar403 = auVar441._10_2_ + 0x80;
          sVar406 = auVar441._12_2_ + 0x80;
          sVar409 = auVar441._14_2_ + 0x80;
          auVar441 = psraw(auVar475,2);
          auVar476._0_2_ = auVar441._0_2_ * local_78;
          auVar476._2_2_ = auVar441._2_2_ * sStack_76;
          auVar476._4_2_ = auVar441._4_2_ * local_78;
          auVar476._6_2_ = auVar441._6_2_ * sStack_76;
          auVar476._8_2_ = auVar441._8_2_ * local_78;
          auVar476._10_2_ = auVar441._10_2_ * sStack_76;
          auVar476._12_2_ = auVar441._12_2_ * local_78;
          auVar476._14_2_ = auVar441._14_2_ * sStack_76;
          auVar441 = psraw(auVar476,8);
          sVar421 = auVar441._0_2_ + 0x80;
          sVar422 = auVar441._2_2_ + 0x80;
          sVar477 = auVar441._4_2_ + 0x80;
          sVar478 = auVar441._6_2_ + 0x80;
          sVar479 = auVar441._8_2_ + 0x80;
          sVar480 = auVar441._10_2_ + 0x80;
          sVar481 = auVar441._12_2_ + 0x80;
          sVar482 = auVar441._14_2_ + 0x80;
          puVar2 = U + lVar337 + uVar338;
          *puVar2 = (0 < sVar412) * (sVar412 < 0x100) * (char)sVar412 - (0xff < sVar412);
          puVar2[1] = (0 < sVar392) * (sVar392 < 0x100) * (char)sVar392 - (0xff < sVar392);
          puVar2[2] = (0 < sVar414) * (sVar414 < 0x100) * (char)sVar414 - (0xff < sVar414);
          puVar2[3] = (0 < sVar415) * (sVar415 < 0x100) * (char)sVar415 - (0xff < sVar415);
          puVar2[4] = (0 < sVar416) * (sVar416 < 0x100) * (char)sVar416 - (0xff < sVar416);
          puVar2[5] = (0 < sVar417) * (sVar417 < 0x100) * (char)sVar417 - (0xff < sVar417);
          puVar2[6] = (0 < sVar419) * (sVar419 < 0x100) * (char)sVar419 - (0xff < sVar419);
          puVar2[7] = (0 < sVar420) * (sVar420 < 0x100) * (char)sVar420 - (0xff < sVar420);
          puVar2[8] = (0 < sVar492) * (sVar492 < 0x100) * (char)sVar492 - (0xff < sVar492);
          puVar2[9] = (0 < sVar503) * (sVar503 < 0x100) * (char)sVar503 - (0xff < sVar503);
          puVar2[10] = (0 < sVar504) * (sVar504 < 0x100) * (char)sVar504 - (0xff < sVar504);
          puVar2[0xb] = (0 < sVar505) * (sVar505 < 0x100) * (char)sVar505 - (0xff < sVar505);
          puVar2[0xc] = (0 < sVar506) * (sVar506 < 0x100) * (char)sVar506 - (0xff < sVar506);
          puVar2[0xd] = (0 < sVar507) * (sVar507 < 0x100) * (char)sVar507 - (0xff < sVar507);
          puVar2[0xe] = (0 < sVar508) * (sVar508 < 0x100) * (char)sVar508 - (0xff < sVar508);
          puVar2[0xf] = (0 < sVar509) * (sVar509 < 0x100) * (char)sVar509 - (0xff < sVar509);
          puVar2 = V + lVar337 + uVar338;
          *puVar2 = (0 < sVar345) * (sVar345 < 0x100) * (char)sVar345 - (0xff < sVar345);
          puVar2[1] = (0 < sVar386) * (sVar386 < 0x100) * (char)sVar386 - (0xff < sVar386);
          puVar2[2] = (0 < sVar390) * (sVar390 < 0x100) * (char)sVar390 - (0xff < sVar390);
          puVar2[3] = (0 < sVar395) * (sVar395 < 0x100) * (char)sVar395 - (0xff < sVar395);
          puVar2[4] = (0 < sVar399) * (sVar399 < 0x100) * (char)sVar399 - (0xff < sVar399);
          puVar2[5] = (0 < sVar403) * (sVar403 < 0x100) * (char)sVar403 - (0xff < sVar403);
          puVar2[6] = (0 < sVar406) * (sVar406 < 0x100) * (char)sVar406 - (0xff < sVar406);
          puVar2[7] = (0 < sVar409) * (sVar409 < 0x100) * (char)sVar409 - (0xff < sVar409);
          puVar2[8] = (0 < sVar421) * (sVar421 < 0x100) * (char)sVar421 - (0xff < sVar421);
          puVar2[9] = (0 < sVar422) * (sVar422 < 0x100) * (char)sVar422 - (0xff < sVar422);
          puVar2[10] = (0 < sVar477) * (sVar477 < 0x100) * (char)sVar477 - (0xff < sVar477);
          puVar2[0xb] = (0 < sVar478) * (sVar478 < 0x100) * (char)sVar478 - (0xff < sVar478);
          puVar2[0xc] = (0 < sVar479) * (sVar479 < 0x100) * (char)sVar479 - (0xff < sVar479);
          puVar2[0xd] = (0 < sVar480) * (sVar480 < 0x100) * (char)sVar480 - (0xff < sVar480);
          puVar2[0xe] = (0 < sVar481) * (sVar481 < 0x100) * (char)sVar481 - (0xff < sVar481);
          puVar2[0xf] = (0 < sVar482) * (sVar482 < 0x100) * (char)sVar482 - (0xff < sVar482);
          uVar341 = uVar341 + 0x20;
          lVar337 = lVar337 + 0x10;
        } while (uVar341 < width - 0x1f);
      }
      uVar340 = uVar340 + 2;
      uVar339 = (ulong)(uint)((int)uVar339 + iVar22);
      RGBA_stride = RGBA_stride + iVar22;
      uVar342 = (ulong)(uint)((int)uVar342 + iVar23);
      Y_stride = Y_stride + iVar23;
    } while (uVar340 < height - 1);
  }
  return;
}

Assistant:

void rgb32_yuv420_sse(uint32_t width, uint32_t height, 
	const uint8_t *RGBA, uint32_t RGBA_stride, 
	uint8_t *Y, uint8_t *U, uint8_t *V, uint32_t Y_stride, uint32_t UV_stride, 
	YCbCrType yuv_type)
{
	#define LOAD_SI128 _mm_load_si128
	#define SAVE_SI128 _mm_stream_si128
	const RGB2YUVParam *const param = &(RGB2YUV[yuv_type]);
	
	uint32_t x, y;
	for(y=0; y<(height-1); y+=2)
	{
		const uint8_t *rgb_ptr1=RGBA+y*RGBA_stride,
			*rgb_ptr2=RGBA+(y+1)*RGBA_stride;
		
		uint8_t *y_ptr1=Y+y*Y_stride,
			*y_ptr2=Y+(y+1)*Y_stride,
			*u_ptr=U+(y/2)*UV_stride,
			*v_ptr=V+(y/2)*UV_stride;
		
		for(x=0; x<(width-31); x+=32)
		{
			RGBA2YUV_32
			
			rgb_ptr1+=128;
			rgb_ptr2+=128;
			y_ptr1+=32;
			y_ptr2+=32;
			u_ptr+=16; 
			v_ptr+=16;
		}
	}
	#undef LOAD_SI128
	#undef SAVE_SI128
}